

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  ulong uVar75;
  RayK<8> *pRVar76;
  byte bVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  bool bVar81;
  uint uVar82;
  Geometry *geometry;
  long lVar83;
  ulong uVar84;
  float fVar85;
  float fVar86;
  float fVar133;
  float fVar135;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar139;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined4 uVar140;
  undefined8 uVar141;
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar168;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar169;
  float fVar170;
  float fVar181;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar183;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  vint4 ai;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7d9;
  RTCFilterFunctionNArguments local_7a0;
  undefined1 local_770 [8];
  float fStack_768;
  float fStack_764;
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  LinearSpace3fa *local_670;
  Primitive *local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  byte local_370;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar75 = (ulong)(byte)PVar6;
  lVar25 = uVar75 * 0x25;
  fVar170 = *(float *)(prim + lVar25 + 0x12);
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar91 = vsubps_avx(auVar91,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar165._0_4_ = fVar170 * auVar91._0_4_;
  auVar165._4_4_ = fVar170 * auVar91._4_4_;
  auVar165._8_4_ = fVar170 * auVar91._8_4_;
  auVar165._12_4_ = fVar170 * auVar91._12_4_;
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar142._0_4_ = fVar170 * auVar90._0_4_;
  auVar142._4_4_ = fVar170 * auVar90._4_4_;
  auVar142._8_4_ = fVar170 * auVar90._8_4_;
  auVar142._12_4_ = fVar170 * auVar90._12_4_;
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 5 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xf + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar75 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar184._4_4_ = auVar142._0_4_;
  auVar184._0_4_ = auVar142._0_4_;
  auVar184._8_4_ = auVar142._0_4_;
  auVar184._12_4_ = auVar142._0_4_;
  auVar93 = vshufps_avx(auVar142,auVar142,0x55);
  auVar94 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar170 = auVar94._0_4_;
  auVar159._0_4_ = fVar170 * auVar92._0_4_;
  fVar152 = auVar94._4_4_;
  auVar159._4_4_ = fVar152 * auVar92._4_4_;
  fVar169 = auVar94._8_4_;
  auVar159._8_4_ = fVar169 * auVar92._8_4_;
  fVar181 = auVar94._12_4_;
  auVar159._12_4_ = fVar181 * auVar92._12_4_;
  auVar153._0_4_ = auVar20._0_4_ * fVar170;
  auVar153._4_4_ = auVar20._4_4_ * fVar152;
  auVar153._8_4_ = auVar20._8_4_ * fVar169;
  auVar153._12_4_ = auVar20._12_4_ * fVar181;
  auVar143._0_4_ = auVar23._0_4_ * fVar170;
  auVar143._4_4_ = auVar23._4_4_ * fVar152;
  auVar143._8_4_ = auVar23._8_4_ * fVar169;
  auVar143._12_4_ = auVar23._12_4_ * fVar181;
  auVar94 = vfmadd231ps_fma(auVar159,auVar93,auVar90);
  auVar27 = vfmadd231ps_fma(auVar153,auVar93,auVar19);
  auVar93 = vfmadd231ps_fma(auVar143,auVar22,auVar93);
  auVar95 = vfmadd231ps_fma(auVar94,auVar184,auVar91);
  auVar27 = vfmadd231ps_fma(auVar27,auVar184,auVar216);
  auVar28 = vfmadd231ps_fma(auVar93,auVar21,auVar184);
  auVar206._4_4_ = auVar165._0_4_;
  auVar206._0_4_ = auVar165._0_4_;
  auVar206._8_4_ = auVar165._0_4_;
  auVar206._12_4_ = auVar165._0_4_;
  auVar93 = vshufps_avx(auVar165,auVar165,0x55);
  auVar94 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar170 = auVar94._0_4_;
  auVar185._0_4_ = fVar170 * auVar92._0_4_;
  fVar152 = auVar94._4_4_;
  auVar185._4_4_ = fVar152 * auVar92._4_4_;
  fVar169 = auVar94._8_4_;
  auVar185._8_4_ = fVar169 * auVar92._8_4_;
  fVar181 = auVar94._12_4_;
  auVar185._12_4_ = fVar181 * auVar92._12_4_;
  auVar171._0_4_ = auVar20._0_4_ * fVar170;
  auVar171._4_4_ = auVar20._4_4_ * fVar152;
  auVar171._8_4_ = auVar20._8_4_ * fVar169;
  auVar171._12_4_ = auVar20._12_4_ * fVar181;
  auVar166._0_4_ = auVar23._0_4_ * fVar170;
  auVar166._4_4_ = auVar23._4_4_ * fVar152;
  auVar166._8_4_ = auVar23._8_4_ * fVar169;
  auVar166._12_4_ = auVar23._12_4_ * fVar181;
  auVar90 = vfmadd231ps_fma(auVar185,auVar93,auVar90);
  auVar92 = vfmadd231ps_fma(auVar171,auVar93,auVar19);
  auVar19 = vfmadd231ps_fma(auVar166,auVar93,auVar22);
  auVar29 = vfmadd231ps_fma(auVar90,auVar206,auVar91);
  auVar142 = vfmadd231ps_fma(auVar92,auVar206,auVar216);
  auVar198._8_4_ = 0x7fffffff;
  auVar198._0_8_ = 0x7fffffff7fffffff;
  auVar198._12_4_ = 0x7fffffff;
  auVar143 = vfmadd231ps_fma(auVar19,auVar206,auVar21);
  auVar91 = vandps_avx(auVar198,auVar95);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar91,auVar195,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar87._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar95._12_4_;
  auVar91 = vandps_avx(auVar198,auVar27);
  uVar84 = vcmpps_avx512vl(auVar91,auVar195,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar88._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar27._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar27._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar27._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar27._12_4_;
  auVar91 = vandps_avx(auVar198,auVar28);
  uVar84 = vcmpps_avx512vl(auVar91,auVar195,1);
  bVar81 = (bool)((byte)uVar84 & 1);
  auVar89._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar28._0_4_;
  bVar81 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar28._4_4_;
  bVar81 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar28._8_4_;
  bVar81 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar28._12_4_;
  auVar90 = vrcp14ps_avx512vl(auVar87);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = &DAT_3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar91 = vfnmadd213ps_fma(auVar87,auVar90,auVar196);
  auVar95 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vfnmadd213ps_fma(auVar88,auVar90,auVar196);
  auVar28 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar89);
  auVar91 = vfnmadd213ps_fma(auVar89,auVar90,auVar196);
  auVar26 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  fVar170 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar193._4_4_ = fVar170;
  auVar193._0_4_ = fVar170;
  auVar193._8_4_ = fVar170;
  auVar193._12_4_ = fVar170;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar91 = vpmovsxwd_avx(auVar91);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar75 * 0xb + 6);
  auVar90 = vpmovsxwd_avx(auVar90);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar216 = vsubps_avx(auVar90,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar75 * 9 + 6);
  auVar90 = vpmovsxwd_avx(auVar92);
  auVar92 = vfmadd213ps_fma(auVar216,auVar193,auVar91);
  auVar91 = vcvtdq2ps_avx(auVar90);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar75 * 0xd + 6);
  auVar90 = vpmovsxwd_avx(auVar216);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar216 = vfmadd213ps_fma(auVar90,auVar193,auVar91);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar75 * 0x12 + 6);
  auVar91 = vpmovsxwd_avx(auVar19);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar84 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar75 * 2 + uVar84 + 6);
  auVar90 = vpmovsxwd_avx(auVar20);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar19 = vfmadd213ps_fma(auVar90,auVar193,auVar91);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar91 = vpmovsxwd_avx(auVar21);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar75 * 0x18 + 6);
  auVar90 = vpmovsxwd_avx(auVar22);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar20 = vfmadd213ps_fma(auVar90,auVar193,auVar91);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar75 * 0x1d + 6);
  auVar91 = vpmovsxwd_avx(auVar23);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar75 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar90 = vpmovsxwd_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar21 = vfmadd213ps_fma(auVar90,auVar193,auVar91);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar75) + 6);
  auVar91 = vpmovsxwd_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar75 * 0x23 + 6);
  auVar90 = vpmovsxwd_avx(auVar27);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar91);
  auVar90 = vfmadd213ps_fma(auVar90,auVar193,auVar91);
  auVar91 = vsubps_avx(auVar92,auVar29);
  auVar194._0_4_ = auVar95._0_4_ * auVar91._0_4_;
  auVar194._4_4_ = auVar95._4_4_ * auVar91._4_4_;
  auVar194._8_4_ = auVar95._8_4_ * auVar91._8_4_;
  auVar194._12_4_ = auVar95._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar216,auVar29);
  auVar160._0_4_ = auVar95._0_4_ * auVar91._0_4_;
  auVar160._4_4_ = auVar95._4_4_ * auVar91._4_4_;
  auVar160._8_4_ = auVar95._8_4_ * auVar91._8_4_;
  auVar160._12_4_ = auVar95._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar19,auVar142);
  auVar186._0_4_ = auVar28._0_4_ * auVar91._0_4_;
  auVar186._4_4_ = auVar28._4_4_ * auVar91._4_4_;
  auVar186._8_4_ = auVar28._8_4_ * auVar91._8_4_;
  auVar186._12_4_ = auVar28._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar20,auVar142);
  auVar154._0_4_ = auVar28._0_4_ * auVar91._0_4_;
  auVar154._4_4_ = auVar28._4_4_ * auVar91._4_4_;
  auVar154._8_4_ = auVar28._8_4_ * auVar91._8_4_;
  auVar154._12_4_ = auVar28._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar21,auVar143);
  auVar172._0_4_ = auVar26._0_4_ * auVar91._0_4_;
  auVar172._4_4_ = auVar26._4_4_ * auVar91._4_4_;
  auVar172._8_4_ = auVar26._8_4_ * auVar91._8_4_;
  auVar172._12_4_ = auVar26._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar90,auVar143);
  auVar144._0_4_ = auVar26._0_4_ * auVar91._0_4_;
  auVar144._4_4_ = auVar26._4_4_ * auVar91._4_4_;
  auVar144._8_4_ = auVar26._8_4_ * auVar91._8_4_;
  auVar144._12_4_ = auVar26._12_4_ * auVar91._12_4_;
  auVar91 = vpminsd_avx(auVar194,auVar160);
  auVar90 = vpminsd_avx(auVar186,auVar154);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar90 = vpminsd_avx(auVar172,auVar144);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar95._4_4_ = uVar140;
  auVar95._0_4_ = uVar140;
  auVar95._8_4_ = uVar140;
  auVar95._12_4_ = uVar140;
  auVar90 = vmaxps_avx512vl(auVar90,auVar95);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar91,auVar28);
  auVar91 = vpmaxsd_avx(auVar194,auVar160);
  auVar90 = vpmaxsd_avx(auVar186,auVar154);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar90 = vpmaxsd_avx(auVar172,auVar144);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar26._4_4_ = uVar140;
  auVar26._0_4_ = uVar140;
  auVar26._8_4_ = uVar140;
  auVar26._12_4_ = uVar140;
  auVar90 = vminps_avx512vl(auVar90,auVar26);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar29);
  auVar90 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_2b0,auVar91,2);
  uVar84 = vpcmpgtd_avx512vl(auVar90,_DAT_01ff0cf0);
  uVar84 = ((byte)uVar141 & 0xf) & uVar84;
  local_7d9 = (char)uVar84 != '\0';
  if (local_7d9) {
    local_670 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_668 = prim;
    do {
      lVar25 = 0;
      for (uVar75 = uVar84; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar82 = *(uint *)(local_668 + 2);
      pGVar8 = (context->scene->geometries).items[uVar82].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_668 + lVar25 * 4 + 6));
      uVar75 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,*(uint *)(local_668 + lVar25 * 4 + 6)) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar170 = (pGVar8->time_range).lower;
      fVar170 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar170) / ((pGVar8->time_range).upper - fVar170)
                );
      auVar91 = vroundss_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),9);
      auVar91 = vminss_avx(auVar91,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
      auVar91 = vmaxss_avx(ZEXT816(0) << 0x20,auVar91);
      fVar170 = fVar170 - auVar91._0_4_;
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar79 = (long)(int)auVar91._0_4_ * 0x38;
      lVar25 = *(long *)(_Var9 + 0x10 + lVar79);
      lVar83 = *(long *)(_Var9 + 0x38 + lVar79);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar79);
      auVar155._4_4_ = fVar170;
      auVar155._0_4_ = fVar170;
      auVar155._8_4_ = fVar170;
      auVar155._12_4_ = fVar170;
      pfVar3 = (float *)(lVar83 + uVar75 * lVar10);
      auVar199._0_4_ = fVar170 * *pfVar3;
      auVar199._4_4_ = fVar170 * pfVar3[1];
      auVar199._8_4_ = fVar170 * pfVar3[2];
      auVar199._12_4_ = fVar170 * pfVar3[3];
      pfVar3 = (float *)(lVar83 + (uVar75 + 1) * lVar10);
      auVar200._0_4_ = fVar170 * *pfVar3;
      auVar200._4_4_ = fVar170 * pfVar3[1];
      auVar200._8_4_ = fVar170 * pfVar3[2];
      auVar200._12_4_ = fVar170 * pfVar3[3];
      auVar91 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar83 + (uVar75 + 2) * lVar10));
      auVar90 = vmulps_avx512vl(auVar155,*(undefined1 (*) [16])(lVar83 + lVar10 * (uVar75 + 3)));
      lVar83 = *(long *)(_Var9 + lVar79);
      fVar170 = 1.0 - fVar170;
      auVar145._4_4_ = fVar170;
      auVar145._0_4_ = fVar170;
      auVar145._8_4_ = fVar170;
      auVar145._12_4_ = fVar170;
      local_750 = vfmadd231ps_fma(auVar199,auVar145,*(undefined1 (*) [16])(lVar83 + lVar25 * uVar75)
                                 );
      local_510 = vfmadd231ps_fma(auVar200,auVar145,
                                  *(undefined1 (*) [16])(lVar83 + lVar25 * (uVar75 + 1)));
      local_520 = vfmadd231ps_avx512vl
                            (auVar91,auVar145,*(undefined1 (*) [16])(lVar83 + lVar25 * (uVar75 + 2))
                            );
      local_530 = vfmadd231ps_avx512vl
                            (auVar90,auVar145,*(undefined1 (*) [16])(lVar83 + lVar25 * (uVar75 + 3))
                            );
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar25 = (long)iVar7 * 0x44;
      auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar92 = vsubps_avx(local_750,auVar91);
      uVar140 = auVar92._0_4_;
      auVar161._4_4_ = uVar140;
      auVar161._0_4_ = uVar140;
      auVar161._8_4_ = uVar140;
      auVar161._12_4_ = uVar140;
      auVar90 = vshufps_avx(auVar92,auVar92,0x55);
      aVar4 = (local_670->vx).field_0;
      aVar5 = (local_670->vy).field_0;
      fVar170 = (local_670->vz).field_0.m128[0];
      fVar152 = *(float *)((long)&(local_670->vz).field_0 + 4);
      fVar169 = *(float *)((long)&(local_670->vz).field_0 + 8);
      fVar181 = *(float *)((long)&(local_670->vz).field_0 + 0xc);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar202._0_4_ = fVar170 * auVar92._0_4_;
      auVar202._4_4_ = fVar152 * auVar92._4_4_;
      auVar202._8_4_ = fVar169 * auVar92._8_4_;
      auVar202._12_4_ = fVar181 * auVar92._12_4_;
      auVar90 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar90);
      auVar216 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar161);
      auVar92 = vsubps_avx(local_510,auVar91);
      uVar140 = auVar92._0_4_;
      auVar162._4_4_ = uVar140;
      auVar162._0_4_ = uVar140;
      auVar162._8_4_ = uVar140;
      auVar162._12_4_ = uVar140;
      auVar90 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar203._0_4_ = fVar170 * auVar92._0_4_;
      auVar203._4_4_ = fVar152 * auVar92._4_4_;
      auVar203._8_4_ = fVar169 * auVar92._8_4_;
      auVar203._12_4_ = fVar181 * auVar92._12_4_;
      auVar90 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar5,auVar90);
      auVar19 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar162);
      auVar92 = vsubps_avx512vl(local_520,auVar91);
      uVar140 = auVar92._0_4_;
      auVar163._4_4_ = uVar140;
      auVar163._0_4_ = uVar140;
      auVar163._8_4_ = uVar140;
      auVar163._12_4_ = uVar140;
      auVar90 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar204._0_4_ = fVar170 * auVar92._0_4_;
      auVar204._4_4_ = fVar152 * auVar92._4_4_;
      auVar204._8_4_ = fVar169 * auVar92._8_4_;
      auVar204._12_4_ = fVar181 * auVar92._12_4_;
      auVar90 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar90);
      auVar92 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar163);
      auVar90 = vsubps_avx512vl(local_530,auVar91);
      uVar140 = auVar90._0_4_;
      auVar156._4_4_ = uVar140;
      auVar156._0_4_ = uVar140;
      auVar156._8_4_ = uVar140;
      auVar156._12_4_ = uVar140;
      auVar91 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar208._0_4_ = fVar170 * auVar90._0_4_;
      auVar208._4_4_ = fVar152 * auVar90._4_4_;
      auVar208._8_4_ = fVar169 * auVar90._8_4_;
      auVar208._12_4_ = fVar181 * auVar90._12_4_;
      auVar91 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar91);
      auVar20 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar156);
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar25);
      uVar140 = auVar216._0_4_;
      local_560._4_4_ = uVar140;
      local_560._0_4_ = uVar140;
      local_560._8_4_ = uVar140;
      local_560._12_4_ = uVar140;
      local_560._16_4_ = uVar140;
      local_560._20_4_ = uVar140;
      local_560._24_4_ = uVar140;
      local_560._28_4_ = uVar140;
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x484);
      auVar96._8_4_ = 1;
      auVar96._0_8_ = 0x100000001;
      auVar96._12_4_ = 1;
      auVar96._16_4_ = 1;
      auVar96._20_4_ = 1;
      auVar96._24_4_ = 1;
      auVar96._28_4_ = 1;
      local_500 = vpermps_avx2(auVar96,ZEXT1632(auVar216));
      local_580 = vbroadcastss_avx512vl(auVar19);
      local_6e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar19));
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x908);
      local_700 = vbroadcastss_avx512vl(auVar92);
      local_5c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar92));
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0xd8c);
      local_5e0 = vbroadcastss_avx512vl(auVar20);
      auVar219 = ZEXT3264(local_5e0);
      local_600 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      auVar220 = ZEXT3264(local_600);
      auVar96 = vmulps_avx512vl(local_5e0,auVar108);
      auVar97 = vmulps_avx512vl(local_600,auVar108);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_700);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,local_5c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_580);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar113,local_6e0);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar111,local_560);
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar25);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x484);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x908);
      auVar100 = vfmadd231ps_avx512vl(auVar98,auVar111,local_500);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_5e0,auVar98);
      auVar102 = vmulps_avx512vl(local_600,auVar98);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_700);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_5c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_580);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_6e0);
      auVar21 = vfmadd231ps_fma(auVar101,auVar96,local_560);
      auVar22 = vfmadd231ps_fma(auVar102,auVar96,local_500);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar21),auVar99);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar22),auVar100);
      auVar101 = vmulps_avx512vl(auVar100,auVar102);
      auVar104 = vmulps_avx512vl(auVar99,auVar103);
      auVar101 = vsubps_avx512vl(auVar101,auVar104);
      auVar91 = vshufps_avx(local_750,local_750,0xff);
      uVar141 = auVar91._0_8_;
      local_80._8_8_ = uVar141;
      local_80._0_8_ = uVar141;
      local_80._16_8_ = uVar141;
      local_80._24_8_ = uVar141;
      auVar91 = vshufps_avx(local_510,local_510,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar91);
      auVar91 = vshufps_avx512vl(local_520,local_520,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar91);
      auVar91 = vshufps_avx512vl(local_530,local_530,0xff);
      uVar141 = auVar91._0_8_;
      register0x00001248 = uVar141;
      local_e0 = uVar141;
      register0x00001250 = uVar141;
      register0x00001258 = uVar141;
      auVar104 = vmulps_avx512vl(_local_e0,auVar108);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_80);
      auVar105 = vmulps_avx512vl(_local_e0,auVar98);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_a0);
      auVar23 = vfmadd231ps_fma(auVar105,auVar96,local_80);
      auVar105 = vmulps_avx512vl(auVar103,auVar103);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar102);
      auVar106 = vmaxps_avx512vl(auVar104,ZEXT1632(auVar23));
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar105 = vmulps_avx512vl(auVar106,auVar105);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar141 = vcmpps_avx512vl(auVar101,auVar105,2);
      auVar91 = vblendps_avx(auVar216,local_750,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar90 = vandps_avx512vl(auVar91,auVar93);
      auVar91 = vblendps_avx(auVar19,local_510,8);
      auVar91 = vandps_avx512vl(auVar91,auVar93);
      auVar90 = vmaxps_avx(auVar90,auVar91);
      auVar91 = vblendps_avx(auVar92,local_520,8);
      auVar94 = vandps_avx512vl(auVar91,auVar93);
      auVar91 = vblendps_avx(auVar20,local_530,8);
      auVar91 = vandps_avx512vl(auVar91,auVar93);
      auVar91 = vmaxps_avx(auVar94,auVar91);
      auVar91 = vmaxps_avx(auVar90,auVar91);
      auVar90 = vmovshdup_avx(auVar91);
      auVar90 = vmaxss_avx(auVar90,auVar91);
      auVar91 = vshufpd_avx(auVar91,auVar91,1);
      auVar91 = vmaxss_avx(auVar91,auVar90);
      auVar90 = vcvtsi2ss_avx512f(local_520,iVar7);
      local_460._0_16_ = auVar90;
      auVar105._0_4_ = auVar90._0_4_;
      auVar105._4_4_ = auVar105._0_4_;
      auVar105._8_4_ = auVar105._0_4_;
      auVar105._12_4_ = auVar105._0_4_;
      auVar105._16_4_ = auVar105._0_4_;
      auVar105._20_4_ = auVar105._0_4_;
      auVar105._24_4_ = auVar105._0_4_;
      auVar105._28_4_ = auVar105._0_4_;
      uVar24 = vcmpps_avx512vl(auVar105,_DAT_02020f40,0xe);
      local_370 = (byte)uVar141 & (byte)uVar24;
      fVar152 = auVar91._0_4_ * 4.7683716e-07;
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar101,ZEXT1632(auVar216));
      local_120 = vpermps_avx512vl(auVar101,ZEXT1632(auVar19));
      local_140 = vpermps_avx512vl(auVar101,ZEXT1632(auVar92));
      auVar101 = vpermps_avx2(auVar101,ZEXT1632(auVar20));
      fVar170 = *(float *)(ray + k * 4 + 0x60);
      auVar91 = auVar103._0_16_;
      _local_770 = ZEXT416((uint)fVar152);
      if (local_370 == 0) {
        bVar81 = false;
        auVar91 = vxorps_avx512vl(auVar91,auVar91);
        auVar217 = ZEXT1664(auVar91);
        auVar213 = ZEXT3264(local_560);
        auVar214 = ZEXT3264(local_500);
        auVar215 = ZEXT3264(local_580);
        auVar212 = ZEXT3264(local_6e0);
        auVar221 = ZEXT3264(local_700);
        auVar218 = ZEXT3264(local_5c0);
      }
      else {
        fStack_61c = 0.0;
        fStack_618 = 0.0;
        fStack_614 = 0.0;
        auVar98 = vmulps_avx512vl(auVar101,auVar98);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
        auVar108 = vmulps_avx512vl(auVar101,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
        auVar97 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar111,local_100,auVar97);
        auVar111 = vmulps_avx512vl(local_5e0,auVar96);
        auVar97 = vmulps_avx512vl(local_600,auVar96);
        auVar205._0_4_ = auVar101._0_4_ * auVar96._0_4_;
        auVar205._4_4_ = auVar101._4_4_ * auVar96._4_4_;
        auVar205._8_4_ = auVar101._8_4_ * auVar96._8_4_;
        auVar205._12_4_ = auVar101._12_4_ * auVar96._12_4_;
        auVar205._16_4_ = auVar101._16_4_ * auVar96._16_4_;
        auVar205._20_4_ = auVar101._20_4_ * auVar96._20_4_;
        auVar205._24_4_ = auVar101._24_4_ * auVar96._24_4_;
        auVar205._28_4_ = 0;
        auVar221 = ZEXT3264(local_700);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_700);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar108,local_5c0);
        auVar108 = vfmadd231ps_avx512vl(auVar205,local_140,auVar108);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,local_580);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_6e0);
        auVar97 = vfmadd231ps_avx512vl(auVar108,local_120,auVar109);
        auVar107 = vfmadd231ps_avx512vl(auVar111,auVar113,local_560);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,local_500);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1f9c);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar113);
        auVar98 = vmulps_avx512vl(local_5e0,auVar108);
        auVar112 = vmulps_avx512vl(local_600,auVar108);
        auVar113._4_4_ = auVar101._4_4_ * auVar108._4_4_;
        auVar113._0_4_ = auVar101._0_4_ * auVar108._0_4_;
        auVar113._8_4_ = auVar101._8_4_ * auVar108._8_4_;
        auVar113._12_4_ = auVar101._12_4_ * auVar108._12_4_;
        auVar113._16_4_ = auVar101._16_4_ * auVar108._16_4_;
        auVar113._20_4_ = auVar101._20_4_ * auVar108._20_4_;
        auVar113._24_4_ = auVar101._24_4_ * auVar108._24_4_;
        auVar113._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar109,local_700);
        auVar98 = vfmadd231ps_avx512vl(auVar112,auVar109,local_5c0);
        auVar109 = vfmadd231ps_avx512vl(auVar113,local_140,auVar109);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_580);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar113,local_6e0);
        auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar111,local_560);
        auVar108 = vfmadd231ps_avx512vl(auVar98,auVar111,local_500);
        auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
        auVar209._8_4_ = 0x7fffffff;
        auVar209._0_8_ = 0x7fffffff7fffffff;
        auVar209._12_4_ = 0x7fffffff;
        auVar209._16_4_ = 0x7fffffff;
        auVar209._20_4_ = 0x7fffffff;
        auVar209._24_4_ = 0x7fffffff;
        auVar209._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(auVar107,auVar209);
        auVar113 = vandps_avx(auVar96,auVar209);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar97,auVar209);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        auVar97 = vbroadcastss_avx512vl(_local_770);
        uVar75 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar81 = (bool)((byte)uVar75 & 1);
        auVar112._0_4_ = (float)((uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar107._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar107._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar107._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar107._12_4_);
        bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar107._16_4_);
        bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar107._20_4_);
        bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar107._24_4_);
        bVar81 = SUB81(uVar75 >> 7,0);
        auVar112._28_4_ = (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar107._28_4_;
        bVar81 = (bool)((byte)uVar75 & 1);
        auVar114._0_4_ = (float)((uint)bVar81 * auVar103._0_4_ | (uint)!bVar81 * auVar96._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar81 * auVar103._4_4_ | (uint)!bVar81 * auVar96._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar81 * auVar103._8_4_ | (uint)!bVar81 * auVar96._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar81 * auVar103._12_4_ | (uint)!bVar81 * auVar96._12_4_);
        bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar81 * auVar103._16_4_ | (uint)!bVar81 * auVar96._16_4_);
        bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar81 * auVar103._20_4_ | (uint)!bVar81 * auVar96._20_4_);
        bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar81 * auVar103._24_4_ | (uint)!bVar81 * auVar96._24_4_);
        bVar81 = SUB81(uVar75 >> 7,0);
        auVar114._28_4_ = (uint)bVar81 * auVar103._28_4_ | (uint)!bVar81 * auVar96._28_4_;
        auVar111 = vandps_avx(auVar209,auVar109);
        auVar113 = vandps_avx(auVar108,auVar209);
        auVar113 = vmaxps_avx(auVar111,auVar113);
        auVar111 = vandps_avx(auVar98,auVar209);
        auVar111 = vmaxps_avx(auVar113,auVar111);
        uVar75 = vcmpps_avx512vl(auVar111,auVar97,1);
        bVar81 = (bool)((byte)uVar75 & 1);
        auVar115._0_4_ = (float)((uint)bVar81 * auVar102._0_4_ | (uint)!bVar81 * auVar109._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar81 * auVar102._4_4_ | (uint)!bVar81 * auVar109._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar81 * auVar102._8_4_ | (uint)!bVar81 * auVar109._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar81 * auVar102._12_4_ | (uint)!bVar81 * auVar109._12_4_);
        bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar81 * auVar102._16_4_ | (uint)!bVar81 * auVar109._16_4_);
        bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar81 * auVar102._20_4_ | (uint)!bVar81 * auVar109._20_4_);
        bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar81 * auVar102._24_4_ | (uint)!bVar81 * auVar109._24_4_);
        bVar81 = SUB81(uVar75 >> 7,0);
        auVar115._28_4_ = (uint)bVar81 * auVar102._28_4_ | (uint)!bVar81 * auVar109._28_4_;
        bVar81 = (bool)((byte)uVar75 & 1);
        auVar116._0_4_ = (float)((uint)bVar81 * auVar103._0_4_ | (uint)!bVar81 * auVar108._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar81 * auVar103._4_4_ | (uint)!bVar81 * auVar108._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar81 * auVar103._8_4_ | (uint)!bVar81 * auVar108._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar81 * auVar103._12_4_ | (uint)!bVar81 * auVar108._12_4_);
        bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar81 * auVar103._16_4_ | (uint)!bVar81 * auVar108._16_4_);
        bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar81 * auVar103._20_4_ | (uint)!bVar81 * auVar108._20_4_);
        bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar81 * auVar103._24_4_ | (uint)!bVar81 * auVar108._24_4_);
        bVar81 = SUB81(uVar75 >> 7,0);
        auVar116._28_4_ = (uint)bVar81 * auVar103._28_4_ | (uint)!bVar81 * auVar108._28_4_;
        auVar95 = vxorps_avx512vl(auVar91,auVar91);
        auVar217 = ZEXT1664(auVar95);
        auVar111 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar95));
        auVar91 = vfmadd231ps_fma(auVar111,auVar114,auVar114);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar169 = auVar113._0_4_;
        fVar181 = auVar113._4_4_;
        fVar182 = auVar113._8_4_;
        fVar183 = auVar113._12_4_;
        fVar164 = auVar113._16_4_;
        fVar168 = auVar113._20_4_;
        fVar85 = auVar113._24_4_;
        auVar111._4_4_ = fVar181 * fVar181 * fVar181 * auVar91._4_4_ * -0.5;
        auVar111._0_4_ = fVar169 * fVar169 * fVar169 * auVar91._0_4_ * -0.5;
        auVar111._8_4_ = fVar182 * fVar182 * fVar182 * auVar91._8_4_ * -0.5;
        auVar111._12_4_ = fVar183 * fVar183 * fVar183 * auVar91._12_4_ * -0.5;
        auVar111._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar111._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar111._24_4_ = fVar85 * fVar85 * fVar85 * -0.0;
        auVar111._28_4_ = auVar98._28_4_;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar113);
        auVar109._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar109._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar109._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar109._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar109._16_4_ = auVar114._16_4_ * auVar111._16_4_;
        auVar109._20_4_ = auVar114._20_4_ * auVar111._20_4_;
        auVar109._24_4_ = auVar114._24_4_ * auVar111._24_4_;
        auVar109._28_4_ = 0;
        auVar108._4_4_ = auVar111._4_4_ * -auVar112._4_4_;
        auVar108._0_4_ = auVar111._0_4_ * -auVar112._0_4_;
        auVar108._8_4_ = auVar111._8_4_ * -auVar112._8_4_;
        auVar108._12_4_ = auVar111._12_4_ * -auVar112._12_4_;
        auVar108._16_4_ = auVar111._16_4_ * -auVar112._16_4_;
        auVar108._20_4_ = auVar111._20_4_ * -auVar112._20_4_;
        auVar108._24_4_ = auVar111._24_4_ * -auVar112._24_4_;
        auVar108._28_4_ = auVar114._28_4_;
        auVar111 = vmulps_avx512vl(auVar111,ZEXT1632(auVar95));
        auVar102 = ZEXT1632(auVar95);
        auVar113 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar102);
        auVar91 = vfmadd231ps_fma(auVar113,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
        fVar169 = auVar113._0_4_;
        fVar181 = auVar113._4_4_;
        fVar182 = auVar113._8_4_;
        fVar183 = auVar113._12_4_;
        fVar164 = auVar113._16_4_;
        fVar168 = auVar113._20_4_;
        fVar85 = auVar113._24_4_;
        auVar97._4_4_ = fVar181 * fVar181 * fVar181 * auVar91._4_4_ * -0.5;
        auVar97._0_4_ = fVar169 * fVar169 * fVar169 * auVar91._0_4_ * -0.5;
        auVar97._8_4_ = fVar182 * fVar182 * fVar182 * auVar91._8_4_ * -0.5;
        auVar97._12_4_ = fVar183 * fVar183 * fVar183 * auVar91._12_4_ * -0.5;
        auVar97._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar97._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar97._24_4_ = fVar85 * fVar85 * fVar85 * -0.0;
        auVar97._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar113);
        auVar107._4_4_ = auVar116._4_4_ * auVar96._4_4_;
        auVar107._0_4_ = auVar116._0_4_ * auVar96._0_4_;
        auVar107._8_4_ = auVar116._8_4_ * auVar96._8_4_;
        auVar107._12_4_ = auVar116._12_4_ * auVar96._12_4_;
        auVar107._16_4_ = auVar116._16_4_ * auVar96._16_4_;
        auVar107._20_4_ = auVar116._20_4_ * auVar96._20_4_;
        auVar107._24_4_ = auVar116._24_4_ * auVar96._24_4_;
        auVar107._28_4_ = auVar113._28_4_;
        auVar98._4_4_ = -auVar115._4_4_ * auVar96._4_4_;
        auVar98._0_4_ = -auVar115._0_4_ * auVar96._0_4_;
        auVar98._8_4_ = -auVar115._8_4_ * auVar96._8_4_;
        auVar98._12_4_ = -auVar115._12_4_ * auVar96._12_4_;
        auVar98._16_4_ = -auVar115._16_4_ * auVar96._16_4_;
        auVar98._20_4_ = -auVar115._20_4_ * auVar96._20_4_;
        auVar98._24_4_ = -auVar115._24_4_ * auVar96._24_4_;
        auVar98._28_4_ = auVar115._28_4_ ^ 0x80000000;
        auVar113 = vmulps_avx512vl(auVar96,auVar102);
        auVar91 = vfmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar90 = vfmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar96 = vfmadd213ps_avx512vl(auVar111,auVar104,auVar110);
        auVar97 = vfmadd213ps_avx512vl(auVar107,ZEXT1632(auVar23),ZEXT1632(auVar21));
        auVar93 = vfnmadd213ps_fma(auVar109,auVar104,auVar99);
        auVar99 = ZEXT1632(auVar23);
        auVar92 = vfmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar22));
        auVar94 = vfnmadd213ps_fma(auVar108,auVar104,auVar100);
        auVar216 = vfmadd213ps_fma(auVar113,auVar99,auVar106);
        auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar104,auVar111);
        auVar21 = vfnmadd213ps_fma(auVar107,auVar99,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar98,auVar99,ZEXT1632(auVar22));
        auVar27 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar23),auVar113);
        auVar113 = vsubps_avx512vl(auVar97,ZEXT1632(auVar93));
        auVar111 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar94));
        auVar108 = vsubps_avx512vl(ZEXT1632(auVar216),auVar109);
        auVar107 = vmulps_avx512vl(auVar111,auVar109);
        auVar19 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar94),auVar108);
        auVar99._4_4_ = auVar93._4_4_ * auVar108._4_4_;
        auVar99._0_4_ = auVar93._0_4_ * auVar108._0_4_;
        auVar99._8_4_ = auVar93._8_4_ * auVar108._8_4_;
        auVar99._12_4_ = auVar93._12_4_ * auVar108._12_4_;
        auVar99._16_4_ = auVar108._16_4_ * 0.0;
        auVar99._20_4_ = auVar108._20_4_ * 0.0;
        auVar99._24_4_ = auVar108._24_4_ * 0.0;
        auVar99._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar99,auVar109,auVar113);
        auVar100._4_4_ = auVar94._4_4_ * auVar113._4_4_;
        auVar100._0_4_ = auVar94._0_4_ * auVar113._0_4_;
        auVar100._8_4_ = auVar94._8_4_ * auVar113._8_4_;
        auVar100._12_4_ = auVar94._12_4_ * auVar113._12_4_;
        auVar100._16_4_ = auVar113._16_4_ * 0.0;
        auVar100._20_4_ = auVar113._20_4_ * 0.0;
        auVar100._24_4_ = auVar113._24_4_ * 0.0;
        auVar100._28_4_ = auVar113._28_4_;
        auVar20 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar93),auVar111);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar102,auVar108);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,ZEXT1632(auVar19));
        auVar112 = ZEXT1632(auVar95);
        uVar75 = vcmpps_avx512vl(auVar111,auVar112,2);
        bVar77 = (byte)uVar75;
        fVar85 = (float)((uint)(bVar77 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar21._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        fVar133 = (float)((uint)bVar81 * auVar91._4_4_ | (uint)!bVar81 * auVar21._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        fVar135 = (float)((uint)bVar81 * auVar91._8_4_ | (uint)!bVar81 * auVar21._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        fVar137 = (float)((uint)bVar81 * auVar91._12_4_ | (uint)!bVar81 * auVar21._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar85))));
        fVar86 = (float)((uint)(bVar77 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar22._0_4_);
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        fVar134 = (float)((uint)bVar81 * auVar90._4_4_ | (uint)!bVar81 * auVar22._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        fVar136 = (float)((uint)bVar81 * auVar90._8_4_ | (uint)!bVar81 * auVar22._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        fVar138 = (float)((uint)bVar81 * auVar90._12_4_ | (uint)!bVar81 * auVar22._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar86))));
        auVar110._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar27._0_4_)
        ;
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * auVar27._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * auVar27._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * auVar27._12_4_);
        fVar169 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar96._16_4_);
        auVar110._16_4_ = fVar169;
        fVar181 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar96._20_4_);
        auVar110._20_4_ = fVar181;
        fVar182 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar96._24_4_);
        auVar110._24_4_ = fVar182;
        iVar1 = (uint)(byte)(uVar75 >> 7) * auVar96._28_4_;
        auVar110._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar97);
        auVar117._0_4_ =
             (uint)(bVar77 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar19._0_4_;
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar81 * auVar113._4_4_ | (uint)!bVar81 * auVar19._4_4_;
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar81 * auVar113._8_4_ | (uint)!bVar81 * auVar19._8_4_;
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar81 * auVar113._12_4_ | (uint)!bVar81 * auVar19._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar113._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar113._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar113._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar92));
        auVar118._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar90._0_4_
                    );
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar81 * auVar113._4_4_ | (uint)!bVar81 * auVar90._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar81 * auVar113._8_4_ | (uint)!bVar81 * auVar90._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar81 * auVar113._12_4_ | (uint)!bVar81 * auVar90._12_4_);
        fVar183 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar113._16_4_);
        auVar118._16_4_ = fVar183;
        fVar168 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar113._20_4_);
        auVar118._20_4_ = fVar168;
        fVar164 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar113._24_4_);
        auVar118._24_4_ = fVar164;
        auVar118._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar216));
        auVar119._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar96._0_4_
                    );
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar81 * auVar113._4_4_ | (uint)!bVar81 * auVar96._4_4_);
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar81 * auVar113._8_4_ | (uint)!bVar81 * auVar96._8_4_);
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar81 * auVar113._12_4_ | (uint)!bVar81 * auVar96._12_4_);
        bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar81 * auVar113._16_4_ | (uint)!bVar81 * auVar96._16_4_);
        bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar81 * auVar113._20_4_ | (uint)!bVar81 * auVar96._20_4_);
        bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar81 * auVar113._24_4_ | (uint)!bVar81 * auVar96._24_4_);
        bVar81 = SUB81(uVar75 >> 7,0);
        auVar119._28_4_ = (uint)bVar81 * auVar113._28_4_ | (uint)!bVar81 * auVar96._28_4_;
        auVar120._0_4_ =
             (uint)(bVar77 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar97._0_4_;
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar81 * (int)auVar93._4_4_ | (uint)!bVar81 * auVar97._4_4_;
        bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar81 * (int)auVar93._8_4_ | (uint)!bVar81 * auVar97._8_4_;
        bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar81 * (int)auVar93._12_4_ | (uint)!bVar81 * auVar97._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar75 >> 4) & 1) * auVar97._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar75 >> 5) & 1) * auVar97._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar75 >> 6) & 1) * auVar97._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar97._28_4_;
        bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar77 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar216._0_4_;
        bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar216._4_4_;
        bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar216._8_4_;
        bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar216._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar109._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar109._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar109._24_4_;
        iVar2 = (uint)(byte)(uVar75 >> 7) * auVar109._28_4_;
        auVar121._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar120,auVar107);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar94._12_4_ |
                                                 (uint)!bVar14 * auVar92._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar94._8_4_ |
                                                          (uint)!bVar13 * auVar92._8_4_,
                                                          CONCAT44((uint)bVar81 * (int)auVar94._4_4_
                                                                   | (uint)!bVar81 * auVar92._4_4_,
                                                                   (uint)(bVar77 & 1) *
                                                                   (int)auVar94._0_4_ |
                                                                   (uint)!(bool)(bVar77 & 1) *
                                                                   auVar92._0_4_)))),auVar98);
        auVar109 = vsubps_avx(auVar121,auVar110);
        auVar108 = vsubps_avx(auVar107,auVar117);
        auVar96 = vsubps_avx(auVar98,auVar118);
        auVar97 = vsubps_avx(auVar110,auVar119);
        auVar102._4_4_ = auVar109._4_4_ * fVar133;
        auVar102._0_4_ = auVar109._0_4_ * fVar85;
        auVar102._8_4_ = auVar109._8_4_ * fVar135;
        auVar102._12_4_ = auVar109._12_4_ * fVar137;
        auVar102._16_4_ = auVar109._16_4_ * 0.0;
        auVar102._20_4_ = auVar109._20_4_ * 0.0;
        auVar102._24_4_ = auVar109._24_4_ * 0.0;
        auVar102._28_4_ = iVar2;
        auVar91 = vfmsub231ps_fma(auVar102,auVar110,auVar99);
        auVar103._4_4_ = fVar134 * auVar99._4_4_;
        auVar103._0_4_ = fVar86 * auVar99._0_4_;
        auVar103._8_4_ = fVar136 * auVar99._8_4_;
        auVar103._12_4_ = fVar138 * auVar99._12_4_;
        auVar103._16_4_ = auVar99._16_4_ * 0.0;
        auVar103._20_4_ = auVar99._20_4_ * 0.0;
        auVar103._24_4_ = auVar99._24_4_ * 0.0;
        auVar103._28_4_ = auVar111._28_4_;
        auVar90 = vfmsub231ps_fma(auVar103,auVar107,auVar113);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,ZEXT1632(auVar91));
        auVar175._0_4_ = auVar113._0_4_ * auVar110._0_4_;
        auVar175._4_4_ = auVar113._4_4_ * auVar110._4_4_;
        auVar175._8_4_ = auVar113._8_4_ * auVar110._8_4_;
        auVar175._12_4_ = auVar113._12_4_ * auVar110._12_4_;
        auVar175._16_4_ = auVar113._16_4_ * fVar169;
        auVar175._20_4_ = auVar113._20_4_ * fVar181;
        auVar175._24_4_ = auVar113._24_4_ * fVar182;
        auVar175._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar175,auVar98,auVar109);
        auVar100 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar91));
        auVar111 = vmulps_avx512vl(auVar97,auVar117);
        auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar119);
        auVar106._4_4_ = auVar96._4_4_ * auVar119._4_4_;
        auVar106._0_4_ = auVar96._0_4_ * auVar119._0_4_;
        auVar106._8_4_ = auVar96._8_4_ * auVar119._8_4_;
        auVar106._12_4_ = auVar96._12_4_ * auVar119._12_4_;
        auVar106._16_4_ = auVar96._16_4_ * auVar119._16_4_;
        auVar106._20_4_ = auVar96._20_4_ * auVar119._20_4_;
        auVar106._24_4_ = auVar96._24_4_ * auVar119._24_4_;
        auVar106._28_4_ = auVar119._28_4_;
        auVar91 = vfmsub231ps_fma(auVar106,auVar118,auVar97);
        auVar176._0_4_ = auVar118._0_4_ * auVar108._0_4_;
        auVar176._4_4_ = auVar118._4_4_ * auVar108._4_4_;
        auVar176._8_4_ = auVar118._8_4_ * auVar108._8_4_;
        auVar176._12_4_ = auVar118._12_4_ * auVar108._12_4_;
        auVar176._16_4_ = fVar183 * auVar108._16_4_;
        auVar176._20_4_ = fVar168 * auVar108._20_4_;
        auVar176._24_4_ = fVar164 * auVar108._24_4_;
        auVar176._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar176,auVar96,auVar117);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,auVar111);
        auVar102 = vfmadd231ps_avx512vl(auVar111,auVar112,ZEXT1632(auVar91));
        auVar111 = vmaxps_avx(auVar100,auVar102);
        uVar141 = vcmpps_avx512vl(auVar111,auVar112,2);
        local_370 = local_370 & (byte)uVar141;
        auVar213 = ZEXT3264(local_560);
        auVar214 = ZEXT3264(local_500);
        auVar215 = ZEXT3264(local_580);
        auVar212 = ZEXT3264(local_6e0);
        auVar207 = ZEXT1664(_local_770);
        if (local_370 == 0) {
          local_370 = 0;
        }
        else {
          auVar40._4_4_ = auVar97._4_4_ * auVar113._4_4_;
          auVar40._0_4_ = auVar97._0_4_ * auVar113._0_4_;
          auVar40._8_4_ = auVar97._8_4_ * auVar113._8_4_;
          auVar40._12_4_ = auVar97._12_4_ * auVar113._12_4_;
          auVar40._16_4_ = auVar97._16_4_ * auVar113._16_4_;
          auVar40._20_4_ = auVar97._20_4_ * auVar113._20_4_;
          auVar40._24_4_ = auVar97._24_4_ * auVar113._24_4_;
          auVar40._28_4_ = auVar111._28_4_;
          auVar92 = vfmsub231ps_fma(auVar40,auVar96,auVar109);
          auVar41._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar41._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar41._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar41._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar41._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar41._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar41._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar41._28_4_ = auVar109._28_4_;
          auVar90 = vfmsub231ps_fma(auVar41,auVar99,auVar97);
          auVar42._4_4_ = auVar96._4_4_ * auVar99._4_4_;
          auVar42._0_4_ = auVar96._0_4_ * auVar99._0_4_;
          auVar42._8_4_ = auVar96._8_4_ * auVar99._8_4_;
          auVar42._12_4_ = auVar96._12_4_ * auVar99._12_4_;
          auVar42._16_4_ = auVar96._16_4_ * auVar99._16_4_;
          auVar42._20_4_ = auVar96._20_4_ * auVar99._20_4_;
          auVar42._24_4_ = auVar96._24_4_ * auVar99._24_4_;
          auVar42._28_4_ = auVar96._28_4_;
          auVar216 = vfmsub231ps_fma(auVar42,auVar108,auVar113);
          auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar216));
          auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar92),auVar112);
          auVar113 = vrcp14ps_avx512vl(auVar111);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar33);
          auVar91 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
          auVar43._4_4_ = auVar216._4_4_ * auVar110._4_4_;
          auVar43._0_4_ = auVar216._0_4_ * auVar110._0_4_;
          auVar43._8_4_ = auVar216._8_4_ * auVar110._8_4_;
          auVar43._12_4_ = auVar216._12_4_ * auVar110._12_4_;
          auVar43._16_4_ = fVar169 * 0.0;
          auVar43._20_4_ = fVar181 * 0.0;
          auVar43._24_4_ = fVar182 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar90 = vfmadd231ps_fma(auVar43,auVar98,ZEXT1632(auVar90));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,ZEXT1632(auVar92));
          fVar169 = auVar91._0_4_;
          fVar181 = auVar91._4_4_;
          fVar182 = auVar91._8_4_;
          fVar183 = auVar91._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar183,
                                        CONCAT48(auVar90._8_4_ * fVar182,
                                                 CONCAT44(auVar90._4_4_ * fVar181,
                                                          auVar90._0_4_ * fVar169))));
          auVar197._4_4_ = fVar170;
          auVar197._0_4_ = fVar170;
          auVar197._8_4_ = fVar170;
          auVar197._12_4_ = fVar170;
          auVar197._16_4_ = fVar170;
          auVar197._20_4_ = fVar170;
          auVar197._24_4_ = fVar170;
          auVar197._28_4_ = fVar170;
          uVar141 = vcmpps_avx512vl(auVar197,auVar113,2);
          uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar34._4_4_ = uVar140;
          auVar34._0_4_ = uVar140;
          auVar34._8_4_ = uVar140;
          auVar34._12_4_ = uVar140;
          auVar34._16_4_ = uVar140;
          auVar34._20_4_ = uVar140;
          auVar34._24_4_ = uVar140;
          auVar34._28_4_ = uVar140;
          uVar24 = vcmpps_avx512vl(auVar113,auVar34,2);
          local_370 = (byte)uVar141 & (byte)uVar24 & local_370;
          if (local_370 != 0) {
            uVar141 = vcmpps_avx512vl(auVar111,auVar112,4);
            if ((local_370 & (byte)uVar141) != 0) {
              local_370 = local_370 & (byte)uVar141;
              fVar164 = auVar100._0_4_ * fVar169;
              fVar168 = auVar100._4_4_ * fVar181;
              auVar44._4_4_ = fVar168;
              auVar44._0_4_ = fVar164;
              fVar85 = auVar100._8_4_ * fVar182;
              auVar44._8_4_ = fVar85;
              fVar86 = auVar100._12_4_ * fVar183;
              auVar44._12_4_ = fVar86;
              fVar133 = auVar100._16_4_ * 0.0;
              auVar44._16_4_ = fVar133;
              fVar134 = auVar100._20_4_ * 0.0;
              auVar44._20_4_ = fVar134;
              fVar135 = auVar100._24_4_ * 0.0;
              auVar44._24_4_ = fVar135;
              auVar44._28_4_ = auVar100._28_4_;
              fVar169 = auVar102._0_4_ * fVar169;
              fVar181 = auVar102._4_4_ * fVar181;
              auVar45._4_4_ = fVar181;
              auVar45._0_4_ = fVar169;
              fVar182 = auVar102._8_4_ * fVar182;
              auVar45._8_4_ = fVar182;
              fVar183 = auVar102._12_4_ * fVar183;
              auVar45._12_4_ = fVar183;
              fVar136 = auVar102._16_4_ * 0.0;
              auVar45._16_4_ = fVar136;
              fVar137 = auVar102._20_4_ * 0.0;
              auVar45._20_4_ = fVar137;
              fVar138 = auVar102._24_4_ * 0.0;
              auVar45._24_4_ = fVar138;
              auVar45._28_4_ = auVar102._28_4_;
              auVar189._8_4_ = 0x3f800000;
              auVar189._0_8_ = &DAT_3f8000003f800000;
              auVar189._12_4_ = 0x3f800000;
              auVar189._16_4_ = 0x3f800000;
              auVar189._20_4_ = 0x3f800000;
              auVar189._24_4_ = 0x3f800000;
              auVar189._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar189,auVar44);
              local_720._0_4_ =
                   (uint)(bVar77 & 1) * (int)fVar164 | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
              bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
              local_720._4_4_ = (uint)bVar81 * (int)fVar168 | (uint)!bVar81 * auVar111._4_4_;
              bVar81 = (bool)((byte)(uVar75 >> 2) & 1);
              local_720._8_4_ = (uint)bVar81 * (int)fVar85 | (uint)!bVar81 * auVar111._8_4_;
              bVar81 = (bool)((byte)(uVar75 >> 3) & 1);
              local_720._12_4_ = (uint)bVar81 * (int)fVar86 | (uint)!bVar81 * auVar111._12_4_;
              bVar81 = (bool)((byte)(uVar75 >> 4) & 1);
              local_720._16_4_ = (uint)bVar81 * (int)fVar133 | (uint)!bVar81 * auVar111._16_4_;
              bVar81 = (bool)((byte)(uVar75 >> 5) & 1);
              local_720._20_4_ = (uint)bVar81 * (int)fVar134 | (uint)!bVar81 * auVar111._20_4_;
              bVar81 = (bool)((byte)(uVar75 >> 6) & 1);
              local_720._24_4_ = (uint)bVar81 * (int)fVar135 | (uint)!bVar81 * auVar111._24_4_;
              bVar81 = SUB81(uVar75 >> 7,0);
              local_720._28_4_ = (uint)bVar81 * auVar100._28_4_ | (uint)!bVar81 * auVar111._28_4_;
              auVar111 = vsubps_avx(auVar189,auVar45);
              bVar81 = (bool)((byte)(uVar75 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar75 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar75 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
              bVar17 = SUB81(uVar75 >> 7,0);
              local_2e0._4_4_ = (uint)bVar81 * (int)fVar181 | (uint)!bVar81 * auVar111._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar77 & 1) * (int)fVar169 | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
              local_2e0._8_4_ = (uint)bVar12 * (int)fVar182 | (uint)!bVar12 * auVar111._8_4_;
              local_2e0._12_4_ = (uint)bVar13 * (int)fVar183 | (uint)!bVar13 * auVar111._12_4_;
              local_2e0._16_4_ = (uint)bVar14 * (int)fVar136 | (uint)!bVar14 * auVar111._16_4_;
              local_2e0._20_4_ = (uint)bVar15 * (int)fVar137 | (uint)!bVar15 * auVar111._20_4_;
              local_2e0._24_4_ = (uint)bVar16 * (int)fVar138 | (uint)!bVar16 * auVar111._24_4_;
              local_2e0._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * auVar111._28_4_;
              local_740 = auVar113;
              goto LAB_01c4f47e;
            }
          }
          local_370 = 0;
        }
LAB_01c4f47e:
        auVar220 = ZEXT3264(local_600);
        auVar219 = ZEXT3264(local_5e0);
        auVar218 = ZEXT3264(local_5c0);
        auVar211 = ZEXT3264(auVar101);
        if (local_370 != 0) {
          auVar111 = vsubps_avx(ZEXT1632(auVar23),auVar104);
          auVar91 = vfmadd213ps_fma(auVar111,local_720,auVar104);
          uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar104._4_4_ = uVar140;
          auVar104._0_4_ = uVar140;
          auVar104._8_4_ = uVar140;
          auVar104._12_4_ = uVar140;
          auVar104._16_4_ = uVar140;
          auVar104._20_4_ = uVar140;
          auVar104._24_4_ = uVar140;
          auVar104._28_4_ = uVar140;
          auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                        CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                 CONCAT44(auVar91._4_4_ +
                                                                          auVar91._4_4_,
                                                                          auVar91._0_4_ +
                                                                          auVar91._0_4_)))),auVar104
                                    );
          uVar141 = vcmpps_avx512vl(local_740,auVar111,6);
          local_370 = local_370 & (byte)uVar141;
          if (local_370 != 0) {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar35._8_4_ = 0x40000000;
            auVar35._0_8_ = 0x4000000040000000;
            auVar35._12_4_ = 0x40000000;
            auVar35._16_4_ = 0x40000000;
            auVar35._20_4_ = 0x40000000;
            auVar35._24_4_ = 0x40000000;
            auVar35._28_4_ = 0x40000000;
            local_400 = vfmadd132ps_avx512vl(local_2e0,auVar150,auVar35);
            local_2e0 = local_400;
            auVar111 = local_2e0;
            local_3c0 = 0;
            local_3b0 = local_750._0_8_;
            uStack_3a8 = local_750._8_8_;
            local_3a0 = local_510._0_8_;
            uStack_398 = local_510._8_8_;
            local_390 = local_520._0_8_;
            uStack_388 = local_520._8_8_;
            local_380 = local_530._0_8_;
            uStack_378 = local_530._8_8_;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar81 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar152 = 1.0 / auVar105._0_4_;
                local_360[0] = fVar152 * (local_720._0_4_ + 0.0);
                local_360[1] = fVar152 * (local_720._4_4_ + 1.0);
                local_360[2] = fVar152 * (local_720._8_4_ + 2.0);
                local_360[3] = fVar152 * (local_720._12_4_ + 3.0);
                fStack_350 = fVar152 * (local_720._16_4_ + 4.0);
                fStack_34c = fVar152 * (local_720._20_4_ + 5.0);
                fStack_348 = fVar152 * (local_720._24_4_ + 6.0);
                fStack_344 = local_720._28_4_ + 7.0;
                local_2e0._0_8_ = local_400._0_8_;
                local_2e0._8_8_ = local_400._8_8_;
                local_2e0._16_8_ = local_400._16_8_;
                local_2e0._24_8_ = local_400._24_8_;
                local_340 = local_2e0._0_8_;
                uStack_338 = local_2e0._8_8_;
                uStack_330 = local_2e0._16_8_;
                uStack_328 = local_2e0._24_8_;
                local_320 = local_740;
                local_4a0 = 0;
                uVar80 = (ulong)local_370;
                for (uVar75 = uVar80; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000)
                {
                  local_4a0 = local_4a0 + 1;
                }
                local_4c0 = vpbroadcastd_avx512vl();
                local_760 = local_510._0_4_;
                uStack_75c = local_510._4_4_;
                uStack_758 = local_510._8_8_;
                local_4e0 = vpbroadcastd_avx512vl();
                local_680 = local_520._0_8_;
                uStack_678 = local_520._8_8_;
                local_690 = local_530._0_4_;
                fStack_68c = local_530._4_4_;
                fStack_688 = local_530._8_4_;
                fStack_684 = local_530._12_4_;
                bVar81 = true;
                local_620 = fVar170;
                local_5a0 = auVar101;
                local_420 = local_720;
                local_3e0 = local_740;
                local_3bc = iVar7;
                local_2e0 = auVar111;
                do {
                  auVar216 = auVar217._0_16_;
                  uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar152 = local_360[local_4a0];
                  auVar157._4_4_ = fVar152;
                  auVar157._0_4_ = fVar152;
                  auVar157._8_4_ = fVar152;
                  auVar157._12_4_ = fVar152;
                  local_220._16_4_ = fVar152;
                  local_220._0_16_ = auVar157;
                  local_220._20_4_ = fVar152;
                  local_220._24_4_ = fVar152;
                  local_220._28_4_ = fVar152;
                  local_200 = *(undefined4 *)((long)&local_340 + local_4a0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_4a0 * 4);
                  local_7a0.context = context->user;
                  fVar169 = 1.0 - fVar152;
                  auVar30._8_4_ = 0x80000000;
                  auVar30._0_8_ = 0x8000000080000000;
                  auVar30._12_4_ = 0x80000000;
                  auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar169),auVar30);
                  auVar91 = ZEXT416((uint)(fVar152 * fVar169 * 4.0));
                  auVar90 = vfnmsub213ss_fma(auVar157,auVar157,auVar91);
                  auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),auVar91);
                  fVar169 = fVar169 * auVar92._0_4_ * 0.5;
                  fVar181 = auVar90._0_4_ * 0.5;
                  fVar182 = auVar91._0_4_ * 0.5;
                  fVar152 = fVar152 * fVar152 * 0.5;
                  auVar187._0_4_ = fVar152 * local_690;
                  auVar187._4_4_ = fVar152 * fStack_68c;
                  auVar187._8_4_ = fVar152 * fStack_688;
                  auVar187._12_4_ = fVar152 * fStack_684;
                  auVar146._4_4_ = fVar182;
                  auVar146._0_4_ = fVar182;
                  auVar146._8_4_ = fVar182;
                  auVar146._12_4_ = fVar182;
                  auVar71._8_8_ = uStack_678;
                  auVar71._0_8_ = local_680;
                  auVar91 = vfmadd132ps_fma(auVar146,auVar187,auVar71);
                  auVar173._4_4_ = fVar181;
                  auVar173._0_4_ = fVar181;
                  auVar173._8_4_ = fVar181;
                  auVar173._12_4_ = fVar181;
                  auVar65._4_4_ = uStack_75c;
                  auVar65._0_4_ = local_760;
                  auVar65._8_8_ = uStack_758;
                  auVar91 = vfmadd132ps_fma(auVar173,auVar91,auVar65);
                  auVar147._4_4_ = fVar169;
                  auVar147._0_4_ = fVar169;
                  auVar147._8_4_ = fVar169;
                  auVar147._12_4_ = fVar169;
                  auVar91 = vfmadd132ps_fma(auVar147,auVar91,local_750);
                  local_280 = auVar91._0_4_;
                  auVar177._8_4_ = 1;
                  auVar177._0_8_ = 0x100000001;
                  auVar177._12_4_ = 1;
                  auVar177._16_4_ = 1;
                  auVar177._20_4_ = 1;
                  auVar177._24_4_ = 1;
                  auVar177._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar177,ZEXT1632(auVar91));
                  auVar190._8_4_ = 2;
                  auVar190._0_8_ = 0x200000002;
                  auVar190._12_4_ = 2;
                  auVar190._16_4_ = 2;
                  auVar190._20_4_ = 2;
                  auVar190._24_4_ = 2;
                  auVar190._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar190,ZEXT1632(auVar91));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_4e0._0_8_;
                  uStack_1d8 = local_4e0._8_8_;
                  uStack_1d0 = local_4e0._16_8_;
                  uStack_1c8 = local_4e0._24_8_;
                  local_1c0 = local_4c0;
                  vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_1a0 = (local_7a0.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_7a0.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_6c0 = local_2a0._0_8_;
                  uStack_6b8 = local_2a0._8_8_;
                  uStack_6b0 = local_2a0._16_8_;
                  uStack_6a8 = local_2a0._24_8_;
                  local_7a0.valid = (int *)&local_6c0;
                  local_7a0.geometryUserPtr = pGVar8->userPtr;
                  local_7a0.hit = (RTCHitN *)&local_280;
                  local_7a0.N = 8;
                  local_480 = (undefined4)uVar80;
                  uStack_47c = (undefined4)(uVar80 >> 0x20);
                  local_7a0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_7a0);
                    uVar80 = CONCAT44(uStack_47c,local_480);
                    auVar207 = ZEXT1664(_local_770);
                    auVar211 = ZEXT3264(local_5a0);
                    auVar220 = ZEXT3264(local_600);
                    auVar219 = ZEXT3264(local_5e0);
                    auVar218 = ZEXT3264(local_5c0);
                    auVar221 = ZEXT3264(local_700);
                    auVar212 = ZEXT3264(local_6e0);
                    auVar215 = ZEXT3264(local_580);
                    auVar214 = ZEXT3264(local_500);
                    auVar213 = ZEXT3264(local_560);
                    auVar91 = vxorps_avx512vl(auVar216,auVar216);
                    auVar217 = ZEXT1664(auVar91);
                    fVar170 = local_620;
                  }
                  auVar91 = auVar217._0_16_;
                  auVar66._8_8_ = uStack_6b8;
                  auVar66._0_8_ = local_6c0;
                  auVar66._16_8_ = uStack_6b0;
                  auVar66._24_8_ = uStack_6a8;
                  if (auVar66 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_7a0);
                      uVar80 = CONCAT44(uStack_47c,local_480);
                      auVar207 = ZEXT1664(_local_770);
                      auVar211 = ZEXT3264(local_5a0);
                      auVar220 = ZEXT3264(local_600);
                      auVar219 = ZEXT3264(local_5e0);
                      auVar218 = ZEXT3264(local_5c0);
                      auVar221 = ZEXT3264(local_700);
                      auVar212 = ZEXT3264(local_6e0);
                      auVar215 = ZEXT3264(local_580);
                      auVar214 = ZEXT3264(local_500);
                      auVar213 = ZEXT3264(local_560);
                      auVar91 = vxorps_avx512vl(auVar91,auVar91);
                      auVar217 = ZEXT1664(auVar91);
                      fVar170 = local_620;
                    }
                    auVar101 = auVar211._0_32_;
                    auVar67._8_8_ = uStack_6b8;
                    auVar67._0_8_ = local_6c0;
                    auVar67._16_8_ = uStack_6b0;
                    auVar67._24_8_ = uStack_6a8;
                    uVar75 = vptestmd_avx512vl(auVar67,auVar67);
                    auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar75 & 1);
                    auVar122._0_4_ =
                         (uint)bVar12 * auVar111._0_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x100);
                    bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                    auVar122._4_4_ =
                         (uint)bVar12 * auVar111._4_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x104);
                    bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
                    auVar122._8_4_ =
                         (uint)bVar12 * auVar111._8_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x108);
                    bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar12 * auVar111._12_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x10c);
                    bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
                    auVar122._16_4_ =
                         (uint)bVar12 * auVar111._16_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x110);
                    bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                    auVar122._20_4_ =
                         (uint)bVar12 * auVar111._20_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x114);
                    bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
                    auVar122._24_4_ =
                         (uint)bVar12 * auVar111._24_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x118);
                    bVar12 = SUB81(uVar75 >> 7,0);
                    auVar122._28_4_ =
                         (uint)bVar12 * auVar111._28_4_ |
                         (uint)!bVar12 * *(int *)(local_7a0.ray + 0x11c);
                    *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar122;
                    fVar152 = auVar207._0_4_;
                    if (auVar67 != (undefined1  [32])0x0) break;
                  }
                  auVar101 = auVar211._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar140;
                  uVar75 = local_4a0 & 0x3f;
                  local_4a0 = 0;
                  uVar80 = uVar80 ^ 1L << uVar75;
                  for (uVar75 = uVar80; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000
                      ) {
                    local_4a0 = local_4a0 + 1;
                  }
                  bVar81 = uVar80 != 0;
                  fVar152 = auVar207._0_4_;
                } while (bVar81);
              }
              goto LAB_01c4fa79;
            }
          }
        }
        bVar81 = false;
      }
LAB_01c4fa79:
      local_620 = fVar152;
      if (8 < iVar7) {
        auVar111 = vpbroadcastd_avx512vl();
        auVar207 = ZEXT3264(auVar111);
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar83 = 8;
        fStack_61c = local_620;
        fStack_618 = local_620;
        fStack_614 = local_620;
        fStack_610 = local_620;
        fStack_60c = local_620;
        fStack_608 = local_620;
        fStack_604 = local_620;
        local_5a0 = auVar101;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = fVar170;
        uStack_47c = fVar170;
        uStack_478 = fVar170;
        uStack_474 = fVar170;
        uStack_470 = fVar170;
        uStack_46c = fVar170;
        uStack_468 = fVar170;
        uStack_464 = fVar170;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar111 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar111,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar207._0_32_,auVar96);
          auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar83 * 4 + lVar25);
          auVar113 = *(undefined1 (*) [32])(lVar25 + 0x222bfac + lVar83 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar25 + 0x222c430 + lVar83 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222c8b4 + lVar83 * 4);
          local_5e0 = auVar219._0_32_;
          auVar97 = vmulps_avx512vl(local_5e0,auVar108);
          local_600 = auVar220._0_32_;
          auVar107 = vmulps_avx512vl(local_600,auVar108);
          auVar46._4_4_ = auVar108._4_4_ * (float)local_e0._4_4_;
          auVar46._0_4_ = auVar108._0_4_ * (float)local_e0._0_4_;
          auVar46._8_4_ = auVar108._8_4_ * fStack_d8;
          auVar46._12_4_ = auVar108._12_4_ * fStack_d4;
          auVar46._16_4_ = auVar108._16_4_ * fStack_d0;
          auVar46._20_4_ = auVar108._20_4_ * fStack_cc;
          auVar46._24_4_ = auVar108._24_4_ * fStack_c8;
          auVar46._28_4_ = auVar96._28_4_;
          auVar116 = auVar221._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar116);
          local_5c0 = auVar218._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar107,auVar109,local_5c0);
          auVar107 = vfmadd231ps_avx512vl(auVar46,auVar109,local_c0);
          auVar115 = auVar215._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar115);
          auVar112 = auVar212._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,auVar112);
          auVar91 = vfmadd231ps_fma(auVar107,auVar113,local_a0);
          auVar114 = auVar213._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar114);
          local_500 = auVar214._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar97,auVar111,local_500);
          auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar83 * 4 + lVar25);
          auVar97 = *(undefined1 (*) [32])(lVar25 + 0x222e3cc + lVar83 * 4);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar111,local_80);
          auVar107 = *(undefined1 (*) [32])(lVar25 + 0x222e850 + lVar83 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar25 + 0x222ecd4 + lVar83 * 4);
          auVar101 = vmulps_avx512vl(local_5e0,auVar98);
          auVar99 = vmulps_avx512vl(local_600,auVar98);
          auVar47._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
          auVar47._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
          auVar47._8_4_ = auVar98._8_4_ * fStack_d8;
          auVar47._12_4_ = auVar98._12_4_ * fStack_d4;
          auVar47._16_4_ = auVar98._16_4_ * fStack_d0;
          auVar47._20_4_ = auVar98._20_4_ * fStack_cc;
          auVar47._24_4_ = auVar98._24_4_ * fStack_c8;
          auVar47._28_4_ = uStack_c4;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar116);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_5c0);
          auVar103 = vfmadd231ps_avx512vl(auVar47,auVar107,local_c0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar115);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar112);
          auVar90 = vfmadd231ps_fma(auVar103,auVar97,local_a0);
          auVar103 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar114);
          auVar104 = vfmadd231ps_avx512vl(auVar99,auVar96,local_500);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar96,local_80);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar90));
          auVar101 = vsubps_avx(auVar103,auVar100);
          auVar99 = vsubps_avx(auVar104,auVar102);
          auVar106 = vmulps_avx512vl(auVar102,auVar101);
          auVar110 = vmulps_avx512vl(auVar100,auVar99);
          auVar106 = vsubps_avx512vl(auVar106,auVar110);
          auVar110 = vmulps_avx512vl(auVar99,auVar99);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,auVar101);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar110);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          uVar141 = vcmpps_avx512vl(auVar106,auVar105,2);
          local_370 = (byte)uVar24 & (byte)uVar141;
          if (local_370 == 0) {
            auVar211 = ZEXT3264(auVar112);
            auVar221 = ZEXT3264(auVar116);
          }
          else {
            auVar98 = vmulps_avx512vl(local_5a0,auVar98);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar98);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar107);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_100,auVar97);
            auVar108 = vmulps_avx512vl(local_5a0,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_140,auVar108);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_120,auVar109);
            auVar97 = vfmadd213ps_avx512vl(auVar111,local_100,auVar113);
            auVar111 = *(undefined1 (*) [32])(lVar25 + 0x222cd38 + lVar83 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x222d1bc + lVar83 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar25 + 0x222d640 + lVar83 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222dac4 + lVar83 * 4);
            auVar107 = vmulps_avx512vl(local_5e0,auVar108);
            auVar98 = vmulps_avx512vl(local_600,auVar108);
            auVar108 = vmulps_avx512vl(local_5a0,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar116);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,local_5c0);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_140,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar115);
            auVar107 = vfmadd231ps_avx512vl(auVar98,auVar113,auVar112);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,auVar114);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_500);
            auVar98 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar111 = *(undefined1 (*) [32])(lVar25 + 0x222f158 + lVar83 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x222fa60 + lVar83 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar25 + 0x222fee4 + lVar83 * 4);
            auVar105 = vmulps_avx512vl(local_5e0,auVar109);
            auVar106 = vmulps_avx512vl(local_600,auVar109);
            auVar109 = vmulps_avx512vl(local_5a0,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar116);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_5c0);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_140,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar25 + 0x222f5dc + lVar83 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar115);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar112);
            auVar113 = vfmadd231ps_avx512vl(auVar109,local_120,auVar113);
            auVar109 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar114);
            auVar105 = vfmadd231ps_avx512vl(auVar106,auVar111,local_500);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_100,auVar111);
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar106);
            vandps_avx512vl(auVar107,auVar106);
            auVar111 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar98,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar106);
            auVar73._4_4_ = fStack_61c;
            auVar73._0_4_ = local_620;
            auVar73._8_4_ = fStack_618;
            auVar73._12_4_ = fStack_614;
            auVar73._16_4_ = fStack_610;
            auVar73._20_4_ = fStack_60c;
            auVar73._24_4_ = fStack_608;
            auVar73._28_4_ = fStack_604;
            uVar75 = vcmpps_avx512vl(auVar111,auVar73,1);
            bVar12 = (bool)((byte)uVar75 & 1);
            auVar123._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar108._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar108._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar108._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar108._12_4_);
            bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar108._16_4_);
            bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar108._20_4_);
            bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar108._24_4_);
            bVar12 = SUB81(uVar75 >> 7,0);
            auVar123._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar108._28_4_;
            bVar12 = (bool)((byte)uVar75 & 1);
            auVar124._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar107._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar107._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar107._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar107._12_4_);
            bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar107._16_4_);
            bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar107._20_4_);
            bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar107._24_4_);
            bVar12 = SUB81(uVar75 >> 7,0);
            auVar124._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar106);
            vandps_avx512vl(auVar105,auVar106);
            auVar111 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar113,auVar106);
            auVar111 = vmaxps_avx(auVar111,auVar124);
            uVar75 = vcmpps_avx512vl(auVar111,auVar73,1);
            bVar12 = (bool)((byte)uVar75 & 1);
            auVar125._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar109._0_4_;
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar109._4_4_;
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar109._8_4_;
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar109._12_4_;
            bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar109._16_4_;
            bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar109._20_4_;
            bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar109._24_4_;
            bVar12 = SUB81(uVar75 >> 7,0);
            auVar125._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar109._28_4_;
            bVar12 = (bool)((byte)uVar75 & 1);
            auVar126._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar105._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar105._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar105._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar105._12_4_);
            bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar105._16_4_);
            bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar105._20_4_);
            bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar105._24_4_);
            bVar12 = SUB81(uVar75 >> 7,0);
            auVar126._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar105._28_4_;
            auVar201._8_4_ = 0x80000000;
            auVar201._0_8_ = 0x8000000080000000;
            auVar201._12_4_ = 0x80000000;
            auVar201._16_4_ = 0x80000000;
            auVar201._20_4_ = 0x80000000;
            auVar201._24_4_ = 0x80000000;
            auVar201._28_4_ = 0x80000000;
            auVar111 = vxorps_avx512vl(auVar125,auVar201);
            auVar105 = auVar217._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
            auVar92 = vfmadd231ps_fma(auVar113,auVar124,auVar124);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
            auVar210._8_4_ = 0xbf000000;
            auVar210._0_8_ = 0xbf000000bf000000;
            auVar210._12_4_ = 0xbf000000;
            auVar210._16_4_ = 0xbf000000;
            auVar210._20_4_ = 0xbf000000;
            auVar210._24_4_ = 0xbf000000;
            auVar210._28_4_ = 0xbf000000;
            fVar170 = auVar113._0_4_;
            fVar152 = auVar113._4_4_;
            fVar169 = auVar113._8_4_;
            fVar181 = auVar113._12_4_;
            fVar182 = auVar113._16_4_;
            fVar183 = auVar113._20_4_;
            fVar164 = auVar113._24_4_;
            auVar48._4_4_ = fVar152 * fVar152 * fVar152 * auVar92._4_4_ * -0.5;
            auVar48._0_4_ = fVar170 * fVar170 * fVar170 * auVar92._0_4_ * -0.5;
            auVar48._8_4_ = fVar169 * fVar169 * fVar169 * auVar92._8_4_ * -0.5;
            auVar48._12_4_ = fVar181 * fVar181 * fVar181 * auVar92._12_4_ * -0.5;
            auVar48._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar48._20_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar48._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar48._28_4_ = auVar124._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar48,auVar109,auVar113);
            auVar49._4_4_ = auVar124._4_4_ * auVar113._4_4_;
            auVar49._0_4_ = auVar124._0_4_ * auVar113._0_4_;
            auVar49._8_4_ = auVar124._8_4_ * auVar113._8_4_;
            auVar49._12_4_ = auVar124._12_4_ * auVar113._12_4_;
            auVar49._16_4_ = auVar124._16_4_ * auVar113._16_4_;
            auVar49._20_4_ = auVar124._20_4_ * auVar113._20_4_;
            auVar49._24_4_ = auVar124._24_4_ * auVar113._24_4_;
            auVar49._28_4_ = 0;
            auVar50._4_4_ = auVar113._4_4_ * -auVar123._4_4_;
            auVar50._0_4_ = auVar113._0_4_ * -auVar123._0_4_;
            auVar50._8_4_ = auVar113._8_4_ * -auVar123._8_4_;
            auVar50._12_4_ = auVar113._12_4_ * -auVar123._12_4_;
            auVar50._16_4_ = auVar113._16_4_ * -auVar123._16_4_;
            auVar50._20_4_ = auVar113._20_4_ * -auVar123._20_4_;
            auVar50._24_4_ = auVar113._24_4_ * -auVar123._24_4_;
            auVar50._28_4_ = auVar124._28_4_;
            auVar108 = vmulps_avx512vl(auVar113,auVar105);
            auVar113 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar105);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar126);
            auVar107 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar210);
            fVar170 = auVar107._0_4_;
            fVar152 = auVar107._4_4_;
            fVar169 = auVar107._8_4_;
            fVar181 = auVar107._12_4_;
            fVar182 = auVar107._16_4_;
            fVar183 = auVar107._20_4_;
            fVar164 = auVar107._24_4_;
            auVar51._4_4_ = fVar152 * fVar152 * fVar152 * auVar113._4_4_;
            auVar51._0_4_ = fVar170 * fVar170 * fVar170 * auVar113._0_4_;
            auVar51._8_4_ = fVar169 * fVar169 * fVar169 * auVar113._8_4_;
            auVar51._12_4_ = fVar181 * fVar181 * fVar181 * auVar113._12_4_;
            auVar51._16_4_ = fVar182 * fVar182 * fVar182 * auVar113._16_4_;
            auVar51._20_4_ = fVar183 * fVar183 * fVar183 * auVar113._20_4_;
            auVar51._24_4_ = fVar164 * fVar164 * fVar164 * auVar113._24_4_;
            auVar51._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar51,auVar109,auVar107);
            auVar52._4_4_ = auVar126._4_4_ * auVar113._4_4_;
            auVar52._0_4_ = auVar126._0_4_ * auVar113._0_4_;
            auVar52._8_4_ = auVar126._8_4_ * auVar113._8_4_;
            auVar52._12_4_ = auVar126._12_4_ * auVar113._12_4_;
            auVar52._16_4_ = auVar126._16_4_ * auVar113._16_4_;
            auVar52._20_4_ = auVar126._20_4_ * auVar113._20_4_;
            auVar52._24_4_ = auVar126._24_4_ * auVar113._24_4_;
            auVar52._28_4_ = auVar107._28_4_;
            auVar53._4_4_ = auVar113._4_4_ * auVar111._4_4_;
            auVar53._0_4_ = auVar113._0_4_ * auVar111._0_4_;
            auVar53._8_4_ = auVar113._8_4_ * auVar111._8_4_;
            auVar53._12_4_ = auVar113._12_4_ * auVar111._12_4_;
            auVar53._16_4_ = auVar113._16_4_ * auVar111._16_4_;
            auVar53._20_4_ = auVar113._20_4_ * auVar111._20_4_;
            auVar53._24_4_ = auVar113._24_4_ * auVar111._24_4_;
            auVar53._28_4_ = auVar111._28_4_;
            auVar111 = vmulps_avx512vl(auVar113,auVar105);
            auVar92 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar91),auVar100);
            auVar113 = ZEXT1632(auVar91);
            auVar216 = vfmadd213ps_fma(auVar50,auVar113,auVar102);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar113,auVar97);
            auVar107 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar90),auVar103);
            auVar23 = vfnmadd213ps_fma(auVar49,auVar113,auVar100);
            auVar98 = ZEXT1632(auVar90);
            auVar19 = vfmadd213ps_fma(auVar53,auVar98,auVar104);
            auVar93 = vfnmadd213ps_fma(auVar50,auVar113,auVar102);
            auVar20 = vfmadd213ps_fma(auVar111,auVar98,auVar96);
            auVar102 = ZEXT1632(auVar91);
            auVar95 = vfnmadd231ps_fma(auVar97,auVar102,auVar108);
            auVar94 = vfnmadd213ps_fma(auVar52,auVar98,auVar103);
            auVar27 = vfnmadd213ps_fma(auVar53,auVar98,auVar104);
            auVar28 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar90),auVar111);
            auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar23));
            auVar111 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar93));
            auVar113 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar95));
            auVar54._4_4_ = auVar111._4_4_ * auVar95._4_4_;
            auVar54._0_4_ = auVar111._0_4_ * auVar95._0_4_;
            auVar54._8_4_ = auVar111._8_4_ * auVar95._8_4_;
            auVar54._12_4_ = auVar111._12_4_ * auVar95._12_4_;
            auVar54._16_4_ = auVar111._16_4_ * 0.0;
            auVar54._20_4_ = auVar111._20_4_ * 0.0;
            auVar54._24_4_ = auVar111._24_4_ * 0.0;
            auVar54._28_4_ = auVar108._28_4_;
            auVar91 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar93),auVar113);
            auVar55._4_4_ = auVar113._4_4_ * auVar23._4_4_;
            auVar55._0_4_ = auVar113._0_4_ * auVar23._0_4_;
            auVar55._8_4_ = auVar113._8_4_ * auVar23._8_4_;
            auVar55._12_4_ = auVar113._12_4_ * auVar23._12_4_;
            auVar55._16_4_ = auVar113._16_4_ * 0.0;
            auVar55._20_4_ = auVar113._20_4_ * 0.0;
            auVar55._24_4_ = auVar113._24_4_ * 0.0;
            auVar55._28_4_ = auVar113._28_4_;
            auVar21 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar95),auVar96);
            auVar56._4_4_ = auVar93._4_4_ * auVar96._4_4_;
            auVar56._0_4_ = auVar93._0_4_ * auVar96._0_4_;
            auVar56._8_4_ = auVar93._8_4_ * auVar96._8_4_;
            auVar56._12_4_ = auVar93._12_4_ * auVar96._12_4_;
            auVar56._16_4_ = auVar96._16_4_ * 0.0;
            auVar56._20_4_ = auVar96._20_4_ * 0.0;
            auVar56._24_4_ = auVar96._24_4_ * 0.0;
            auVar56._28_4_ = auVar96._28_4_;
            auVar22 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar23),auVar111);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar105,ZEXT1632(auVar21));
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar91));
            uVar75 = vcmpps_avx512vl(auVar111,auVar105,2);
            bVar77 = (byte)uVar75;
            fVar86 = (float)((uint)(bVar77 & 1) * auVar92._0_4_ |
                            (uint)!(bool)(bVar77 & 1) * auVar94._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            fVar134 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar94._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            fVar136 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar94._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            fVar138 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar94._12_4_);
            auVar98 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar86))));
            fVar133 = (float)((uint)(bVar77 & 1) * auVar216._0_4_ |
                             (uint)!(bool)(bVar77 & 1) * auVar27._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            fVar135 = (float)((uint)bVar12 * auVar216._4_4_ | (uint)!bVar12 * auVar27._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            fVar137 = (float)((uint)bVar12 * auVar216._8_4_ | (uint)!bVar12 * auVar27._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            fVar139 = (float)((uint)bVar12 * auVar216._12_4_ | (uint)!bVar12 * auVar27._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar133))));
            auVar127._0_4_ =
                 (float)((uint)(bVar77 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar28._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar28._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar28._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar28._12_4_);
            fVar152 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar109._16_4_);
            auVar127._16_4_ = fVar152;
            fVar170 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar109._20_4_);
            auVar127._20_4_ = fVar170;
            fVar169 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar109._24_4_);
            auVar127._24_4_ = fVar169;
            iVar1 = (uint)(byte)(uVar75 >> 7) * auVar109._28_4_;
            auVar127._28_4_ = iVar1;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar107);
            auVar128._0_4_ =
                 (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar91._0_4_;
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar91._4_4_;
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar91._8_4_;
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar91._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar111._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar111._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar111._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar19));
            auVar129._0_4_ =
                 (float)((uint)(bVar77 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar92._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar92._4_4_);
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar92._8_4_);
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar92._12_4_);
            fVar182 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar111._16_4_);
            auVar129._16_4_ = fVar182;
            fVar181 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar111._20_4_);
            auVar129._20_4_ = fVar181;
            fVar183 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar111._24_4_);
            auVar129._24_4_ = fVar183;
            auVar129._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar111._28_4_;
            auVar111 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar20));
            auVar130._0_4_ =
                 (float)((uint)(bVar77 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar216._0_4_);
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar216._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar216._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar216._12_4_);
            fVar168 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar111._16_4_);
            auVar130._16_4_ = fVar168;
            fVar164 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar111._20_4_);
            auVar130._20_4_ = fVar164;
            fVar85 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar111._24_4_);
            auVar130._24_4_ = fVar85;
            iVar2 = (uint)(byte)(uVar75 >> 7) * auVar111._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar77 & 1) * (int)auVar23._0_4_ |
                 (uint)!(bool)(bVar77 & 1) * auVar107._0_4_;
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar12 * (int)auVar23._4_4_ | (uint)!bVar12 * auVar107._4_4_;
            bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar12 * (int)auVar23._8_4_ | (uint)!bVar12 * auVar107._8_4_;
            bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar12 * (int)auVar23._12_4_ | (uint)!bVar12 * auVar107._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar75 >> 4) & 1) * auVar107._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar75 >> 5) & 1) * auVar107._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar75 >> 6) & 1) * auVar107._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar107._28_4_;
            bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar131,auVar98);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar93._12_4_ |
                                                     (uint)!bVar16 * auVar19._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar93._8_4_ |
                                                              (uint)!bVar14 * auVar19._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar12 * auVar19._4_4_
                                                                       ,(uint)(bVar77 & 1) *
                                                                        (int)auVar93._0_4_ |
                                                                        (uint)!(bool)(bVar77 & 1) *
                                                                        auVar19._0_4_)))),auVar101);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar95._12_4_ |
                                                     (uint)!bVar17 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar95._8_4_ |
                                                              (uint)!bVar15 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar13 * auVar20._4_4_
                                                                       ,(uint)(bVar77 & 1) *
                                                                        (int)auVar95._0_4_ |
                                                                        (uint)!(bool)(bVar77 & 1) *
                                                                        auVar20._0_4_)))),auVar127);
            auVar108 = vsubps_avx(auVar98,auVar128);
            auVar96 = vsubps_avx(auVar101,auVar129);
            auVar97 = vsubps_avx(auVar127,auVar130);
            auVar57._4_4_ = auVar109._4_4_ * fVar134;
            auVar57._0_4_ = auVar109._0_4_ * fVar86;
            auVar57._8_4_ = auVar109._8_4_ * fVar136;
            auVar57._12_4_ = auVar109._12_4_ * fVar138;
            auVar57._16_4_ = auVar109._16_4_ * 0.0;
            auVar57._20_4_ = auVar109._20_4_ * 0.0;
            auVar57._24_4_ = auVar109._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar57,auVar127,auVar107);
            auVar167._0_4_ = fVar133 * auVar107._0_4_;
            auVar167._4_4_ = fVar135 * auVar107._4_4_;
            auVar167._8_4_ = fVar137 * auVar107._8_4_;
            auVar167._12_4_ = fVar139 * auVar107._12_4_;
            auVar167._16_4_ = auVar107._16_4_ * 0.0;
            auVar167._20_4_ = auVar107._20_4_ * 0.0;
            auVar167._24_4_ = auVar107._24_4_ * 0.0;
            auVar167._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar167,auVar98,auVar113);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar105,ZEXT1632(auVar91));
            auVar178._0_4_ = auVar113._0_4_ * auVar127._0_4_;
            auVar178._4_4_ = auVar113._4_4_ * auVar127._4_4_;
            auVar178._8_4_ = auVar113._8_4_ * auVar127._8_4_;
            auVar178._12_4_ = auVar113._12_4_ * auVar127._12_4_;
            auVar178._16_4_ = auVar113._16_4_ * fVar152;
            auVar178._20_4_ = auVar113._20_4_ * fVar170;
            auVar178._24_4_ = auVar113._24_4_ * fVar169;
            auVar178._28_4_ = 0;
            auVar91 = vfmsub231ps_fma(auVar178,auVar101,auVar109);
            auVar99 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar91));
            auVar111 = vmulps_avx512vl(auVar97,auVar128);
            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar108,auVar130);
            auVar58._4_4_ = auVar96._4_4_ * auVar130._4_4_;
            auVar58._0_4_ = auVar96._0_4_ * auVar130._0_4_;
            auVar58._8_4_ = auVar96._8_4_ * auVar130._8_4_;
            auVar58._12_4_ = auVar96._12_4_ * auVar130._12_4_;
            auVar58._16_4_ = auVar96._16_4_ * fVar168;
            auVar58._20_4_ = auVar96._20_4_ * fVar164;
            auVar58._24_4_ = auVar96._24_4_ * fVar85;
            auVar58._28_4_ = iVar2;
            auVar91 = vfmsub231ps_fma(auVar58,auVar129,auVar97);
            auVar179._0_4_ = auVar129._0_4_ * auVar108._0_4_;
            auVar179._4_4_ = auVar129._4_4_ * auVar108._4_4_;
            auVar179._8_4_ = auVar129._8_4_ * auVar108._8_4_;
            auVar179._12_4_ = auVar129._12_4_ * auVar108._12_4_;
            auVar179._16_4_ = fVar182 * auVar108._16_4_;
            auVar179._20_4_ = fVar181 * auVar108._20_4_;
            auVar179._24_4_ = fVar183 * auVar108._24_4_;
            auVar179._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar179,auVar96,auVar128);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar105,auVar111);
            auVar100 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar91));
            auVar111 = vmaxps_avx(auVar99,auVar100);
            uVar141 = vcmpps_avx512vl(auVar111,auVar105,2);
            local_370 = local_370 & (byte)uVar141;
            if (local_370 == 0) {
LAB_01c50676:
              local_370 = 0;
            }
            else {
              auVar59._4_4_ = auVar97._4_4_ * auVar113._4_4_;
              auVar59._0_4_ = auVar97._0_4_ * auVar113._0_4_;
              auVar59._8_4_ = auVar97._8_4_ * auVar113._8_4_;
              auVar59._12_4_ = auVar97._12_4_ * auVar113._12_4_;
              auVar59._16_4_ = auVar97._16_4_ * auVar113._16_4_;
              auVar59._20_4_ = auVar97._20_4_ * auVar113._20_4_;
              auVar59._24_4_ = auVar97._24_4_ * auVar113._24_4_;
              auVar59._28_4_ = auVar111._28_4_;
              auVar216 = vfmsub231ps_fma(auVar59,auVar96,auVar109);
              auVar60._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar60._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar60._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar60._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar60._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar60._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar60._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar60._28_4_ = auVar109._28_4_;
              auVar92 = vfmsub231ps_fma(auVar60,auVar107,auVar97);
              auVar61._4_4_ = auVar96._4_4_ * auVar107._4_4_;
              auVar61._0_4_ = auVar96._0_4_ * auVar107._0_4_;
              auVar61._8_4_ = auVar96._8_4_ * auVar107._8_4_;
              auVar61._12_4_ = auVar96._12_4_ * auVar107._12_4_;
              auVar61._16_4_ = auVar96._16_4_ * auVar107._16_4_;
              auVar61._20_4_ = auVar96._20_4_ * auVar107._20_4_;
              auVar61._24_4_ = auVar96._24_4_ * auVar107._24_4_;
              auVar61._28_4_ = auVar96._28_4_;
              auVar19 = vfmsub231ps_fma(auVar61,auVar108,auVar113);
              auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar19));
              auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar216),auVar105);
              auVar113 = vrcp14ps_avx512vl(auVar111);
              auVar36._8_4_ = 0x3f800000;
              auVar36._0_8_ = &DAT_3f8000003f800000;
              auVar36._12_4_ = 0x3f800000;
              auVar36._16_4_ = 0x3f800000;
              auVar36._20_4_ = 0x3f800000;
              auVar36._24_4_ = 0x3f800000;
              auVar36._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar36);
              auVar91 = vfmadd132ps_fma(auVar109,auVar113,auVar113);
              auVar62._4_4_ = auVar19._4_4_ * auVar127._4_4_;
              auVar62._0_4_ = auVar19._0_4_ * auVar127._0_4_;
              auVar62._8_4_ = auVar19._8_4_ * auVar127._8_4_;
              auVar62._12_4_ = auVar19._12_4_ * auVar127._12_4_;
              auVar62._16_4_ = fVar152 * 0.0;
              auVar62._20_4_ = fVar170 * 0.0;
              auVar62._24_4_ = fVar169 * 0.0;
              auVar62._28_4_ = iVar1;
              auVar92 = vfmadd231ps_fma(auVar62,auVar101,ZEXT1632(auVar92));
              auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar98,ZEXT1632(auVar216));
              fVar170 = auVar91._0_4_;
              fVar152 = auVar91._4_4_;
              fVar169 = auVar91._8_4_;
              fVar181 = auVar91._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar181,
                                            CONCAT48(auVar92._8_4_ * fVar169,
                                                     CONCAT44(auVar92._4_4_ * fVar152,
                                                              auVar92._0_4_ * fVar170))));
              auVar74._4_4_ = uStack_47c;
              auVar74._0_4_ = local_480;
              auVar74._8_4_ = uStack_478;
              auVar74._12_4_ = uStack_474;
              auVar74._16_4_ = uStack_470;
              auVar74._20_4_ = uStack_46c;
              auVar74._24_4_ = uStack_468;
              auVar74._28_4_ = uStack_464;
              uVar141 = vcmpps_avx512vl(auVar113,auVar74,0xd);
              uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar37._4_4_ = uVar140;
              auVar37._0_4_ = uVar140;
              auVar37._8_4_ = uVar140;
              auVar37._12_4_ = uVar140;
              auVar37._16_4_ = uVar140;
              auVar37._20_4_ = uVar140;
              auVar37._24_4_ = uVar140;
              auVar37._28_4_ = uVar140;
              uVar24 = vcmpps_avx512vl(auVar113,auVar37,2);
              local_370 = (byte)uVar141 & (byte)uVar24 & local_370;
              if (local_370 == 0) goto LAB_01c50676;
              uVar141 = vcmpps_avx512vl(auVar111,auVar105,4);
              if ((local_370 & (byte)uVar141) == 0) {
                local_370 = 0;
              }
              else {
                local_370 = local_370 & (byte)uVar141;
                fVar182 = auVar99._0_4_ * fVar170;
                fVar183 = auVar99._4_4_ * fVar152;
                auVar63._4_4_ = fVar183;
                auVar63._0_4_ = fVar182;
                fVar164 = auVar99._8_4_ * fVar169;
                auVar63._8_4_ = fVar164;
                fVar168 = auVar99._12_4_ * fVar181;
                auVar63._12_4_ = fVar168;
                fVar85 = auVar99._16_4_ * 0.0;
                auVar63._16_4_ = fVar85;
                fVar86 = auVar99._20_4_ * 0.0;
                auVar63._20_4_ = fVar86;
                fVar133 = auVar99._24_4_ * 0.0;
                auVar63._24_4_ = fVar133;
                auVar63._28_4_ = auVar99._28_4_;
                fVar170 = auVar100._0_4_ * fVar170;
                fVar152 = auVar100._4_4_ * fVar152;
                auVar64._4_4_ = fVar152;
                auVar64._0_4_ = fVar170;
                fVar169 = auVar100._8_4_ * fVar169;
                auVar64._8_4_ = fVar169;
                fVar181 = auVar100._12_4_ * fVar181;
                auVar64._12_4_ = fVar181;
                fVar134 = auVar100._16_4_ * 0.0;
                auVar64._16_4_ = fVar134;
                fVar135 = auVar100._20_4_ * 0.0;
                auVar64._20_4_ = fVar135;
                fVar136 = auVar100._24_4_ * 0.0;
                auVar64._24_4_ = fVar136;
                auVar64._28_4_ = auVar100._28_4_;
                auVar191._8_4_ = 0x3f800000;
                auVar191._0_8_ = &DAT_3f8000003f800000;
                auVar191._12_4_ = 0x3f800000;
                auVar191._16_4_ = 0x3f800000;
                auVar191._20_4_ = 0x3f800000;
                auVar191._24_4_ = 0x3f800000;
                auVar191._28_4_ = 0x3f800000;
                auVar111 = vsubps_avx(auVar191,auVar63);
                local_640._0_4_ =
                     (uint)(bVar77 & 1) * (int)fVar182 | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
                bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                local_640._4_4_ = (uint)bVar12 * (int)fVar183 | (uint)!bVar12 * auVar111._4_4_;
                bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
                local_640._8_4_ = (uint)bVar12 * (int)fVar164 | (uint)!bVar12 * auVar111._8_4_;
                bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                local_640._12_4_ = (uint)bVar12 * (int)fVar168 | (uint)!bVar12 * auVar111._12_4_;
                bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
                local_640._16_4_ = (uint)bVar12 * (int)fVar85 | (uint)!bVar12 * auVar111._16_4_;
                bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                local_640._20_4_ = (uint)bVar12 * (int)fVar86 | (uint)!bVar12 * auVar111._20_4_;
                bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
                local_640._24_4_ = (uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar111._24_4_;
                bVar12 = SUB81(uVar75 >> 7,0);
                local_640._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar111._28_4_;
                auVar111 = vsubps_avx(auVar191,auVar64);
                bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar75 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar75 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar75 >> 6) & 1);
                bVar18 = SUB81(uVar75 >> 7,0);
                local_300._4_4_ = (uint)bVar12 * (int)fVar152 | (uint)!bVar12 * auVar111._4_4_;
                local_300._0_4_ =
                     (uint)(bVar77 & 1) * (int)fVar170 | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
                local_300._8_4_ = (uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar111._8_4_;
                local_300._12_4_ = (uint)bVar14 * (int)fVar181 | (uint)!bVar14 * auVar111._12_4_;
                local_300._16_4_ = (uint)bVar15 * (int)fVar134 | (uint)!bVar15 * auVar111._16_4_;
                local_300._20_4_ = (uint)bVar16 * (int)fVar135 | (uint)!bVar16 * auVar111._20_4_;
                local_300._24_4_ = (uint)bVar17 * (int)fVar136 | (uint)!bVar17 * auVar111._24_4_;
                local_300._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar111._28_4_;
                local_660 = auVar113;
              }
            }
            auVar221 = ZEXT3264(local_700);
            auVar211 = ZEXT3264(local_6e0);
            if (local_370 != 0) {
              auVar111 = vsubps_avx(ZEXT1632(auVar90),auVar102);
              auVar91 = vfmadd213ps_fma(auVar111,local_640,auVar102);
              uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar38._4_4_ = uVar140;
              auVar38._0_4_ = uVar140;
              auVar38._8_4_ = uVar140;
              auVar38._12_4_ = uVar140;
              auVar38._16_4_ = uVar140;
              auVar38._20_4_ = uVar140;
              auVar38._24_4_ = uVar140;
              auVar38._28_4_ = uVar140;
              auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                            CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                     CONCAT44(auVar91._4_4_ +
                                                                              auVar91._4_4_,
                                                                              auVar91._0_4_ +
                                                                              auVar91._0_4_)))),
                                         auVar38);
              uVar141 = vcmpps_avx512vl(local_660,auVar111,6);
              local_370 = local_370 & (byte)uVar141;
              if (local_370 != 0) {
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar39._8_4_ = 0x40000000;
                auVar39._0_8_ = 0x4000000040000000;
                auVar39._12_4_ = 0x40000000;
                auVar39._16_4_ = 0x40000000;
                auVar39._20_4_ = 0x40000000;
                auVar39._24_4_ = 0x40000000;
                auVar39._28_4_ = 0x40000000;
                local_400 = vfmadd132ps_avx512vl(local_300,auVar151,auVar39);
                local_300 = local_400;
                auVar111 = local_300;
                local_3c0 = (undefined4)lVar83;
                local_3b0 = local_750._0_8_;
                uStack_3a8 = local_750._8_8_;
                local_3a0 = local_510._0_8_;
                uStack_398 = local_510._8_8_;
                local_390 = local_520._0_8_;
                uStack_388 = local_520._8_8_;
                local_380 = local_530._0_8_;
                uStack_378 = local_530._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar82].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar77 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar77 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar207._0_32_);
                  auVar91 = vcvtsi2ss_avx512f(auVar212._0_16_,local_3c0);
                  fVar170 = auVar91._0_4_;
                  local_360[0] = (fVar170 + local_640._0_4_ + 0.0) * (float)local_4a0;
                  local_360[1] = (fVar170 + local_640._4_4_ + 1.0) * local_4a0._4_4_;
                  local_360[2] = (fVar170 + local_640._8_4_ + 2.0) * fStack_498;
                  local_360[3] = (fVar170 + local_640._12_4_ + 3.0) * fStack_494;
                  fStack_350 = (fVar170 + local_640._16_4_ + 4.0) * fStack_490;
                  fStack_34c = (fVar170 + local_640._20_4_ + 5.0) * fStack_48c;
                  fStack_348 = (fVar170 + local_640._24_4_ + 6.0) * fStack_488;
                  fStack_344 = fVar170 + local_640._28_4_ + 7.0;
                  local_300._0_8_ = local_400._0_8_;
                  local_300._8_8_ = local_400._8_8_;
                  local_300._16_8_ = local_400._16_8_;
                  local_300._24_8_ = local_400._24_8_;
                  local_340 = local_300._0_8_;
                  uStack_338 = local_300._8_8_;
                  uStack_330 = local_300._16_8_;
                  uStack_328 = local_300._24_8_;
                  local_320 = local_660;
                  local_680 = local_510._0_8_;
                  uStack_678 = local_510._8_8_;
                  uVar75 = 0;
                  uVar78 = (ulong)local_370;
                  for (uVar80 = uVar78; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000
                      ) {
                    uVar75 = uVar75 + 1;
                  }
                  local_690 = local_520._0_4_;
                  fStack_68c = local_520._4_4_;
                  fStack_688 = local_520._8_4_;
                  fStack_684 = local_520._12_4_;
                  _local_770 = local_530;
                  local_4e0._0_4_ = 1;
                  local_420 = local_640;
                  local_3e0 = local_660;
                  local_3bc = iVar7;
                  local_300 = auVar111;
                  do {
                    local_760 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar170 = local_360[uVar75];
                    auVar158._4_4_ = fVar170;
                    auVar158._0_4_ = fVar170;
                    auVar158._8_4_ = fVar170;
                    auVar158._12_4_ = fVar170;
                    local_220._16_4_ = fVar170;
                    local_220._0_16_ = auVar158;
                    local_220._20_4_ = fVar170;
                    local_220._24_4_ = fVar170;
                    local_220._28_4_ = fVar170;
                    local_200 = *(undefined4 *)((long)&local_340 + uVar75 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar75 * 4);
                    local_7a0.context = context->user;
                    fVar152 = 1.0 - fVar170;
                    auVar32._8_4_ = 0x80000000;
                    auVar32._0_8_ = 0x8000000080000000;
                    auVar32._12_4_ = 0x80000000;
                    auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar152),auVar32);
                    auVar91 = ZEXT416((uint)(fVar170 * fVar152 * 4.0));
                    auVar90 = vfnmsub213ss_fma(auVar158,auVar158,auVar91);
                    auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),auVar91)
                    ;
                    fVar152 = fVar152 * auVar92._0_4_ * 0.5;
                    fVar169 = auVar90._0_4_ * 0.5;
                    fVar181 = auVar91._0_4_ * 0.5;
                    fVar170 = fVar170 * fVar170 * 0.5;
                    auVar188._0_4_ = fVar170 * (float)local_770._0_4_;
                    auVar188._4_4_ = fVar170 * (float)local_770._4_4_;
                    auVar188._8_4_ = fVar170 * fStack_768;
                    auVar188._12_4_ = fVar170 * fStack_764;
                    auVar148._4_4_ = fVar181;
                    auVar148._0_4_ = fVar181;
                    auVar148._8_4_ = fVar181;
                    auVar148._12_4_ = fVar181;
                    auVar70._4_4_ = fStack_68c;
                    auVar70._0_4_ = local_690;
                    auVar70._8_4_ = fStack_688;
                    auVar70._12_4_ = fStack_684;
                    auVar91 = vfmadd132ps_fma(auVar148,auVar188,auVar70);
                    auVar174._4_4_ = fVar169;
                    auVar174._0_4_ = fVar169;
                    auVar174._8_4_ = fVar169;
                    auVar174._12_4_ = fVar169;
                    auVar72._8_8_ = uStack_678;
                    auVar72._0_8_ = local_680;
                    auVar91 = vfmadd132ps_fma(auVar174,auVar91,auVar72);
                    auVar149._4_4_ = fVar152;
                    auVar149._0_4_ = fVar152;
                    auVar149._8_4_ = fVar152;
                    auVar149._12_4_ = fVar152;
                    auVar91 = vfmadd132ps_fma(auVar149,auVar91,local_750);
                    local_280 = auVar91._0_4_;
                    auVar180._8_4_ = 1;
                    auVar180._0_8_ = 0x100000001;
                    auVar180._12_4_ = 1;
                    auVar180._16_4_ = 1;
                    auVar180._20_4_ = 1;
                    auVar180._24_4_ = 1;
                    auVar180._28_4_ = 1;
                    local_260 = vpermps_avx2(auVar180,ZEXT1632(auVar91));
                    auVar192._8_4_ = 2;
                    auVar192._0_8_ = 0x200000002;
                    auVar192._12_4_ = 2;
                    auVar192._16_4_ = 2;
                    auVar192._20_4_ = 2;
                    auVar192._24_4_ = 2;
                    auVar192._28_4_ = 2;
                    local_240 = vpermps_avx2(auVar192,ZEXT1632(auVar91));
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_440._0_8_;
                    uStack_1d8 = local_440._8_8_;
                    uStack_1d0 = local_440._16_8_;
                    uStack_1c8 = local_440._24_8_;
                    local_1c0 = local_460;
                    vpcmpeqd_avx2(local_460,local_460);
                    local_1a0 = (local_7a0.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_7a0.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_6c0 = local_2a0._0_8_;
                    uStack_6b8 = local_2a0._8_8_;
                    uStack_6b0 = local_2a0._16_8_;
                    uStack_6a8 = local_2a0._24_8_;
                    local_7a0.valid = (int *)&local_6c0;
                    local_7a0.geometryUserPtr = pGVar8->userPtr;
                    local_7a0.hit = (RTCHitN *)&local_280;
                    local_7a0.N = 8;
                    pRVar76 = (RayK<8> *)pGVar8->occlusionFilterN;
                    local_4c0._0_8_ = uVar75;
                    uVar80 = uVar75;
                    local_7a0.ray = (RTCRayN *)ray;
                    if (pRVar76 != (RayK<8> *)0x0) {
                      pRVar76 = (RayK<8> *)(*(code *)pRVar76)(&local_7a0);
                      uVar80 = local_4c0._0_8_;
                    }
                    auVar68._8_8_ = uStack_6b8;
                    auVar68._0_8_ = local_6c0;
                    auVar68._16_8_ = uStack_6b0;
                    auVar68._24_8_ = uStack_6a8;
                    if (auVar68 != (undefined1  [32])0x0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_7a0);
                        uVar80 = local_4c0._0_8_;
                      }
                      auVar91 = auVar217._0_16_;
                      auVar69._8_8_ = uStack_6b8;
                      auVar69._0_8_ = local_6c0;
                      auVar69._16_8_ = uStack_6b0;
                      auVar69._24_8_ = uStack_6a8;
                      uVar75 = vptestmd_avx512vl(auVar69,auVar69);
                      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar75 & 1);
                      auVar132._0_4_ =
                           (uint)bVar12 * auVar111._0_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x100);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      auVar132._4_4_ =
                           (uint)bVar12 * auVar111._4_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x104);
                      bVar12 = (bool)((byte)(uVar75 >> 2) & 1);
                      auVar132._8_4_ =
                           (uint)bVar12 * auVar111._8_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x108);
                      bVar12 = (bool)((byte)(uVar75 >> 3) & 1);
                      auVar132._12_4_ =
                           (uint)bVar12 * auVar111._12_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x10c);
                      bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
                      auVar132._16_4_ =
                           (uint)bVar12 * auVar111._16_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x110);
                      bVar12 = (bool)((byte)(uVar75 >> 5) & 1);
                      auVar132._20_4_ =
                           (uint)bVar12 * auVar111._20_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x114);
                      bVar12 = (bool)((byte)(uVar75 >> 6) & 1);
                      auVar132._24_4_ =
                           (uint)bVar12 * auVar111._24_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x118);
                      bVar12 = SUB81(uVar75 >> 7,0);
                      auVar132._28_4_ =
                           (uint)bVar12 * auVar111._28_4_ |
                           (uint)!bVar12 * *(int *)(local_7a0.ray + 0x11c);
                      *(undefined1 (*) [32])(local_7a0.ray + 0x100) = auVar132;
                      pRVar76 = (RayK<8> *)local_7a0.ray;
                      if (auVar69 != (undefined1  [32])0x0) break;
                    }
                    auVar91 = auVar217._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_760;
                    uVar75 = 0;
                    uVar78 = uVar78 ^ 1L << (uVar80 & 0x3f);
                    for (uVar80 = uVar78; (uVar80 & 1) == 0;
                        uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                      uVar75 = uVar75 + 1;
                    }
                    local_4e0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar76 >> 8),uVar78 != 0);
                  } while (uVar78 != 0);
                  bVar77 = local_4e0[0] & 1;
                  auVar91 = vxorps_avx512vl(auVar91,auVar91);
                  auVar217 = ZEXT1664(auVar91);
                  auVar213 = ZEXT3264(local_560);
                  auVar214 = ZEXT3264(local_500);
                  auVar215 = ZEXT3264(local_580);
                  auVar211 = ZEXT3264(local_6e0);
                  auVar221 = ZEXT3264(local_700);
                  auVar218 = ZEXT3264(local_5c0);
                  auVar219 = ZEXT3264(local_5e0);
                  auVar220 = ZEXT3264(local_600);
                  auVar111 = vmovdqa64_avx512vl(local_160);
                  auVar207 = ZEXT3264(auVar111);
                }
                bVar81 = (bool)(bVar81 | bVar77);
              }
            }
          }
          lVar83 = lVar83 + 8;
          auVar212 = auVar211;
        } while ((int)lVar83 < iVar7);
      }
      if (bVar81 != false) {
        return local_7d9;
      }
      uVar140 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar140;
      auVar31._0_4_ = uVar140;
      auVar31._8_4_ = uVar140;
      auVar31._12_4_ = uVar140;
      uVar141 = vcmpps_avx512vl(local_2b0,auVar31,2);
      uVar82 = (uint)uVar84 & (uint)uVar84 + 0xf & (uint)uVar141;
      uVar84 = (ulong)uVar82;
      local_7d9 = uVar82 != 0;
    } while (local_7d9);
  }
  return local_7d9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }